

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  bool bVar50;
  undefined1 auVar51 [12];
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  uint uVar93;
  uint uVar94;
  ulong uVar95;
  ulong uVar96;
  undefined4 uVar97;
  ulong uVar98;
  long lVar99;
  bool bVar100;
  float fVar101;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar102;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar137 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar145 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  vint4 ai_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar179 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  float fVar202;
  float fVar212;
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar209 [32];
  undefined1 auVar208 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar216;
  float fVar225;
  float fVar226;
  vint4 bi;
  undefined1 auVar235 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar223 [32];
  float fVar246;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar224 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  float fVar233;
  undefined1 auVar236 [16];
  float fVar244;
  float fVar245;
  undefined1 auVar234 [16];
  undefined1 auVar241 [32];
  undefined1 auVar237 [16];
  float fVar247;
  float fVar248;
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  float fVar249;
  float fVar262;
  float fVar263;
  vint4 ai_1;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar264;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  float s;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float t;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar275 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  float fVar284;
  float fVar285;
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar295;
  undefined1 auVar294 [64];
  float fVar296;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar300 [64];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined8 local_b20;
  undefined8 uStack_b18;
  ulong local_b10;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined8 *local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined4 local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  RTCHitN local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  uint local_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint uStack_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar163 [64];
  undefined1 auVar252 [16];
  
  PVar2 = prim[1];
  uVar95 = (ulong)(byte)PVar2;
  fVar101 = *(float *)(prim + uVar95 * 0x19 + 0x12);
  auVar188 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar188 = vinsertps_avx(auVar188,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar112 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar112 = vinsertps_avx(auVar112,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar188 = vsubps_avx(auVar188,*(undefined1 (*) [16])(prim + uVar95 * 0x19 + 6));
  auVar103._0_4_ = fVar101 * auVar188._0_4_;
  auVar103._4_4_ = fVar101 * auVar188._4_4_;
  auVar103._8_4_ = fVar101 * auVar188._8_4_;
  auVar103._12_4_ = fVar101 * auVar188._12_4_;
  auVar217._0_4_ = fVar101 * auVar112._0_4_;
  auVar217._4_4_ = fVar101 * auVar112._4_4_;
  auVar217._8_4_ = fVar101 * auVar112._8_4_;
  auVar217._12_4_ = fVar101 * auVar112._12_4_;
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 5 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 6)));
  auVar286 = vcvtdq2ps_avx(auVar286);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar235 = vcvtdq2ps_avx(auVar235);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar95 + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  uVar98 = (ulong)(uint)((int)(uVar95 * 9) * 2);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + uVar95 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar98 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar300 = ZEXT1664(auVar133);
  auVar307._4_4_ = auVar217._0_4_;
  auVar307._0_4_ = auVar217._0_4_;
  auVar307._8_4_ = auVar217._0_4_;
  auVar307._12_4_ = auVar217._0_4_;
  auVar128 = vshufps_avx(auVar217,auVar217,0x55);
  auVar104 = vshufps_avx(auVar217,auVar217,0xaa);
  fVar101 = auVar104._0_4_;
  auVar280._0_4_ = fVar101 * auVar286._0_4_;
  fVar233 = auVar104._4_4_;
  auVar280._4_4_ = fVar233 * auVar286._4_4_;
  fVar244 = auVar104._8_4_;
  auVar280._8_4_ = fVar244 * auVar286._8_4_;
  fVar102 = auVar104._12_4_;
  auVar280._12_4_ = fVar102 * auVar286._12_4_;
  auVar272._0_4_ = auVar141._0_4_ * fVar101;
  auVar272._4_4_ = auVar141._4_4_ * fVar233;
  auVar272._8_4_ = auVar141._8_4_ * fVar244;
  auVar272._12_4_ = auVar141._12_4_ * fVar102;
  auVar250._0_4_ = auVar133._0_4_ * fVar101;
  auVar250._4_4_ = auVar133._4_4_ * fVar233;
  auVar250._8_4_ = auVar133._8_4_ * fVar244;
  auVar250._12_4_ = auVar133._12_4_ * fVar102;
  auVar104 = vfmadd231ps_fma(auVar280,auVar128,auVar112);
  auVar129 = vfmadd231ps_fma(auVar272,auVar128,auVar235);
  auVar128 = vfmadd231ps_fma(auVar250,auVar105,auVar128);
  auVar179 = vfmadd231ps_fma(auVar104,auVar307,auVar188);
  auVar129 = vfmadd231ps_fma(auVar129,auVar307,auVar6);
  auVar204 = vfmadd231ps_fma(auVar128,auVar106,auVar307);
  auVar308._4_4_ = auVar103._0_4_;
  auVar308._0_4_ = auVar103._0_4_;
  auVar308._8_4_ = auVar103._0_4_;
  auVar308._12_4_ = auVar103._0_4_;
  auVar128 = vshufps_avx(auVar103,auVar103,0x55);
  auVar104 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar101 = auVar104._0_4_;
  auVar218._0_4_ = fVar101 * auVar286._0_4_;
  fVar233 = auVar104._4_4_;
  auVar218._4_4_ = fVar233 * auVar286._4_4_;
  fVar244 = auVar104._8_4_;
  auVar218._8_4_ = fVar244 * auVar286._8_4_;
  fVar102 = auVar104._12_4_;
  auVar218._12_4_ = fVar102 * auVar286._12_4_;
  auVar127._0_4_ = auVar141._0_4_ * fVar101;
  auVar127._4_4_ = auVar141._4_4_ * fVar233;
  auVar127._8_4_ = auVar141._8_4_ * fVar244;
  auVar127._12_4_ = auVar141._12_4_ * fVar102;
  auVar104._0_4_ = auVar133._0_4_ * fVar101;
  auVar104._4_4_ = auVar133._4_4_ * fVar233;
  auVar104._8_4_ = auVar133._8_4_ * fVar244;
  auVar104._12_4_ = auVar133._12_4_ * fVar102;
  auVar112 = vfmadd231ps_fma(auVar218,auVar128,auVar112);
  auVar286 = vfmadd231ps_fma(auVar127,auVar128,auVar235);
  auVar235 = vfmadd231ps_fma(auVar104,auVar128,auVar105);
  auVar141 = vfmadd231ps_fma(auVar112,auVar308,auVar188);
  auVar105 = vfmadd231ps_fma(auVar286,auVar308,auVar6);
  auVar133 = vfmadd231ps_fma(auVar235,auVar308,auVar106);
  local_920._8_4_ = 0x7fffffff;
  local_920._0_8_ = 0x7fffffff7fffffff;
  local_920._12_4_ = 0x7fffffff;
  auVar188 = vandps_avx(auVar179,local_920);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar188 = vcmpps_avx(auVar188,auVar203,1);
  auVar112 = vblendvps_avx(auVar179,auVar203,auVar188);
  auVar188 = vandps_avx(auVar129,local_920);
  auVar188 = vcmpps_avx(auVar188,auVar203,1);
  auVar286 = vblendvps_avx(auVar129,auVar203,auVar188);
  auVar188 = vandps_avx(auVar204,local_920);
  auVar188 = vcmpps_avx(auVar188,auVar203,1);
  auVar188 = vblendvps_avx(auVar204,auVar203,auVar188);
  auVar6 = vrcpps_avx(auVar112);
  auVar234._8_4_ = 0x3f800000;
  auVar234._0_8_ = &DAT_3f8000003f800000;
  auVar234._12_4_ = 0x3f800000;
  auVar112 = vfnmadd213ps_fma(auVar112,auVar6,auVar234);
  auVar6 = vfmadd132ps_fma(auVar112,auVar6,auVar6);
  auVar112 = vrcpps_avx(auVar286);
  auVar286 = vfnmadd213ps_fma(auVar286,auVar112,auVar234);
  auVar235 = vfmadd132ps_fma(auVar286,auVar112,auVar112);
  auVar112 = vrcpps_avx(auVar188);
  auVar188 = vfnmadd213ps_fma(auVar188,auVar112,auVar234);
  auVar106 = vfmadd132ps_fma(auVar188,auVar112,auVar112);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar95 * 7 + 6);
  auVar188 = vpmovsxwd_avx(auVar188);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar141);
  auVar204._0_4_ = auVar6._0_4_ * auVar188._0_4_;
  auVar204._4_4_ = auVar6._4_4_ * auVar188._4_4_;
  auVar204._8_4_ = auVar6._8_4_ * auVar188._8_4_;
  auVar204._12_4_ = auVar6._12_4_ * auVar188._12_4_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar95 * 9 + 6);
  auVar188 = vpmovsxwd_avx(auVar112);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar141);
  auVar219._0_4_ = auVar6._0_4_ * auVar188._0_4_;
  auVar219._4_4_ = auVar6._4_4_ * auVar188._4_4_;
  auVar219._8_4_ = auVar6._8_4_ * auVar188._8_4_;
  auVar219._12_4_ = auVar6._12_4_ * auVar188._12_4_;
  auVar129._1_3_ = 0;
  auVar129[0] = PVar2;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar112 = vpmovsxwd_avx(auVar286);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar95 * -2 + 6);
  auVar188 = vpmovsxwd_avx(auVar6);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar105);
  auVar251._0_4_ = auVar188._0_4_ * auVar235._0_4_;
  auVar251._4_4_ = auVar188._4_4_ * auVar235._4_4_;
  auVar251._8_4_ = auVar188._8_4_ * auVar235._8_4_;
  auVar251._12_4_ = auVar188._12_4_ * auVar235._12_4_;
  auVar188 = vcvtdq2ps_avx(auVar112);
  auVar188 = vsubps_avx(auVar188,auVar105);
  auVar128._0_4_ = auVar235._0_4_ * auVar188._0_4_;
  auVar128._4_4_ = auVar235._4_4_ * auVar188._4_4_;
  auVar128._8_4_ = auVar235._8_4_ * auVar188._8_4_;
  auVar128._12_4_ = auVar235._12_4_ * auVar188._12_4_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar98 + uVar95 + 6);
  auVar188 = vpmovsxwd_avx(auVar235);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar133);
  auVar179._0_4_ = auVar106._0_4_ * auVar188._0_4_;
  auVar179._4_4_ = auVar106._4_4_ * auVar188._4_4_;
  auVar179._8_4_ = auVar106._8_4_ * auVar188._8_4_;
  auVar179._12_4_ = auVar106._12_4_ * auVar188._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 6);
  auVar188 = vpmovsxwd_avx(auVar141);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar133);
  auVar105._0_4_ = auVar106._0_4_ * auVar188._0_4_;
  auVar105._4_4_ = auVar106._4_4_ * auVar188._4_4_;
  auVar105._8_4_ = auVar106._8_4_ * auVar188._8_4_;
  auVar105._12_4_ = auVar106._12_4_ * auVar188._12_4_;
  auVar188 = vpminsd_avx(auVar204,auVar219);
  auVar112 = vpminsd_avx(auVar251,auVar128);
  auVar188 = vmaxps_avx(auVar188,auVar112);
  auVar112 = vpminsd_avx(auVar179,auVar105);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar265._4_4_ = uVar97;
  auVar265._0_4_ = uVar97;
  auVar265._8_4_ = uVar97;
  auVar265._12_4_ = uVar97;
  auVar112 = vmaxps_avx(auVar112,auVar265);
  auVar188 = vmaxps_avx(auVar188,auVar112);
  local_4b0._0_4_ = auVar188._0_4_ * 0.99999964;
  local_4b0._4_4_ = auVar188._4_4_ * 0.99999964;
  local_4b0._8_4_ = auVar188._8_4_ * 0.99999964;
  local_4b0._12_4_ = auVar188._12_4_ * 0.99999964;
  auVar188 = vpmaxsd_avx(auVar204,auVar219);
  auVar112 = vpmaxsd_avx(auVar251,auVar128);
  auVar188 = vminps_avx(auVar188,auVar112);
  auVar112 = vpmaxsd_avx(auVar179,auVar105);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar133._4_4_ = uVar97;
  auVar133._0_4_ = uVar97;
  auVar133._8_4_ = uVar97;
  auVar133._12_4_ = uVar97;
  auVar112 = vminps_avx(auVar112,auVar133);
  auVar188 = vminps_avx(auVar188,auVar112);
  auVar106._0_4_ = auVar188._0_4_ * 1.0000004;
  auVar106._4_4_ = auVar188._4_4_ * 1.0000004;
  auVar106._8_4_ = auVar188._8_4_ * 1.0000004;
  auVar106._12_4_ = auVar188._12_4_ * 1.0000004;
  auVar129[4] = PVar2;
  auVar129._5_3_ = 0;
  auVar129[8] = PVar2;
  auVar129._9_3_ = 0;
  auVar129[0xc] = PVar2;
  auVar129._13_3_ = 0;
  auVar112 = vpcmpgtd_avx(auVar129,_DAT_01ff0cf0);
  auVar188 = vcmpps_avx(local_4b0,auVar106,2);
  auVar188 = vandps_avx(auVar188,auVar112);
  uVar92 = vmovmskps_avx(auVar188);
  if (uVar92 == 0) {
    return;
  }
  uVar92 = uVar92 & 0xff;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_220 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_9c8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_840 = 0x7fffffff;
  uStack_83c = 0x7fffffff;
  uStack_838 = 0x7fffffff;
  uStack_834 = 0x7fffffff;
  uStack_830 = 0x7fffffff;
  uStack_82c = 0x7fffffff;
  uStack_828 = 0x7fffffff;
  uStack_824 = 0x7fffffff;
  local_5e0 = 0x80000000;
  uStack_5dc = 0x80000000;
  uStack_5d8 = 0x80000000;
  uStack_5d4 = 0x80000000;
  fStack_5d0 = -0.0;
  fStack_5cc = -0.0;
  fStack_5c8 = -0.0;
  uStack_5c4 = 0x80000000;
  local_890 = prim;
LAB_016b76e3:
  lVar99 = 0;
  local_888 = (ulong)uVar92;
  for (uVar98 = local_888; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
    lVar99 = lVar99 + 1;
  }
  uVar92 = *(uint *)(local_890 + 2);
  local_700 = *(uint *)(local_890 + lVar99 * 4 + 6);
  local_b10 = (ulong)local_700;
  pGVar4 = (context->scene->geometries).items[uVar92].ptr;
  uVar98 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_b10);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar99 = *(long *)&pGVar4[1].time_range.upper;
  auVar188 = *(undefined1 (*) [16])(lVar99 + (long)p_Var5 * uVar98);
  auVar112 = *(undefined1 (*) [16])(lVar99 + (uVar98 + 1) * (long)p_Var5);
  local_888 = local_888 - 1 & local_888;
  if (local_888 != 0) {
    uVar96 = local_888 - 1 & local_888;
    for (uVar95 = local_888; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
    }
    if (uVar96 != 0) {
      for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar286 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar6 = vinsertps_avx(auVar286,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar252._4_4_ = uVar97;
  auVar252._0_4_ = uVar97;
  auVar252._8_4_ = uVar97;
  auVar252._12_4_ = uVar97;
  fStack_7b0 = (float)uVar97;
  _local_7c0 = auVar252;
  fStack_7ac = (float)uVar97;
  fStack_7a8 = (float)uVar97;
  register0x0000141c = uVar97;
  auVar261 = ZEXT3264(_local_7c0);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar266._4_4_ = uVar97;
  auVar266._0_4_ = uVar97;
  auVar266._8_4_ = uVar97;
  auVar266._12_4_ = uVar97;
  fStack_7f0 = (float)uVar97;
  _local_800 = auVar266;
  fStack_7ec = (float)uVar97;
  fStack_7e8 = (float)uVar97;
  register0x0000145c = uVar97;
  auVar286 = vunpcklps_avx(auVar252,auVar266);
  fVar101 = *(float *)(ray + k * 4 + 0x60);
  auVar273._4_4_ = fVar101;
  auVar273._0_4_ = fVar101;
  auVar273._8_4_ = fVar101;
  auVar273._12_4_ = fVar101;
  fStack_810 = fVar101;
  _local_820 = auVar273;
  fStack_80c = fVar101;
  fStack_808 = fVar101;
  uStack_804 = fVar101;
  local_910 = vinsertps_avx(auVar286,auVar273,0x28);
  auVar282 = ZEXT1664(local_910);
  auVar220._0_4_ = (auVar188._0_4_ + auVar112._0_4_) * 0.5;
  auVar220._4_4_ = (auVar188._4_4_ + auVar112._4_4_) * 0.5;
  auVar220._8_4_ = (auVar188._8_4_ + auVar112._8_4_) * 0.5;
  auVar220._12_4_ = (auVar188._12_4_ + auVar112._12_4_) * 0.5;
  auVar286 = vsubps_avx(auVar220,auVar6);
  auVar286 = vdpps_avx(auVar286,local_910,0x7f);
  local_930 = vdpps_avx(local_910,local_910,0x7f);
  auVar294 = ZEXT1664(local_930);
  auVar235 = vrcpss_avx(local_930,local_930);
  auVar141 = vfnmadd213ss_fma(auVar235,local_930,ZEXT416(0x40000000));
  auVar242 = ZEXT1664(auVar141);
  local_240 = auVar286._0_4_ * auVar235._0_4_ * auVar141._0_4_;
  auVar231._4_4_ = local_240;
  auVar231._0_4_ = local_240;
  auVar231._8_4_ = local_240;
  auVar231._12_4_ = local_240;
  fStack_770 = local_240;
  _local_780 = auVar231;
  fStack_76c = local_240;
  fStack_768 = local_240;
  fStack_764 = local_240;
  auVar286 = vfmadd231ps_fma(auVar6,local_910,auVar231);
  auVar286 = vblendps_avx(auVar286,_DAT_01feba10,8);
  local_a40 = vsubps_avx(auVar188,auVar286);
  local_a50 = vsubps_avx(*(undefined1 (*) [16])(lVar99 + (uVar98 + 2) * (long)p_Var5),auVar286);
  local_a60 = vsubps_avx(auVar112,auVar286);
  _local_a70 = vsubps_avx(*(undefined1 (*) [16])(lVar99 + (uVar98 + 3) * (long)p_Var5),auVar286);
  auVar201 = ZEXT1664(_local_a70);
  auVar188 = vmovshdup_avx(local_a40);
  local_1a0 = auVar188._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar188 = vshufps_avx(local_a40,local_a40,0xaa);
  local_300 = auVar188._0_8_;
  uStack_2f8 = local_300;
  uStack_2f0 = local_300;
  uStack_2e8 = local_300;
  auVar188 = vshufps_avx(local_a40,local_a40,0xff);
  local_320 = auVar188._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar188 = vmovshdup_avx(local_a60);
  local_1c0 = auVar188._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar188 = vshufps_avx(local_a60,local_a60,0xaa);
  local_340 = auVar188._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar188 = vshufps_avx(local_a60,local_a60,0xff);
  local_360 = auVar188._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar188 = vmovshdup_avx(local_a50);
  local_380 = auVar188._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar188 = vshufps_avx(local_a50,local_a50,0xaa);
  local_3a0 = auVar188._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar188 = vshufps_avx(local_a50,local_a50,0xff);
  local_3c0 = auVar188._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar188 = vmovshdup_avx(_local_a70);
  local_3e0 = auVar188._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar188 = vshufps_avx(_local_a70,_local_a70,0xaa);
  local_400 = auVar188._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar188 = vshufps_avx(_local_a70,_local_a70,0xff);
  local_420 = auVar188._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar188 = vfmadd231ps_fma(ZEXT432((uint)(fVar101 * fVar101)),_local_800,_local_800);
  auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),_local_7c0,_local_7c0);
  uVar97 = auVar188._0_4_;
  local_1e0._4_4_ = uVar97;
  local_1e0._0_4_ = uVar97;
  local_1e0._8_4_ = uVar97;
  local_1e0._12_4_ = uVar97;
  local_1e0._16_4_ = uVar97;
  local_1e0._20_4_ = uVar97;
  local_1e0._24_4_ = uVar97;
  local_1e0._28_4_ = uVar97;
  fVar101 = *(float *)(ray + k * 4 + 0x30);
  local_8a0 = ZEXT416((uint)local_240);
  local_240 = fVar101 - local_240;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  uVar98 = 1;
  uVar95 = 0;
  local_440 = local_a40._0_4_;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  local_460 = local_a60._0_4_;
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  local_480 = local_a50._0_4_;
  uStack_47c = local_480;
  uStack_478 = local_480;
  uStack_474 = local_480;
  uStack_470 = local_480;
  uStack_46c = local_480;
  uStack_468 = local_480;
  uStack_464 = local_480;
  local_200 = local_a70._0_4_;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  auVar124._4_4_ = uStack_83c;
  auVar124._0_4_ = local_840;
  auVar124._8_4_ = uStack_838;
  auVar124._12_4_ = uStack_834;
  auVar124._16_4_ = uStack_830;
  auVar124._20_4_ = uStack_82c;
  auVar124._24_4_ = uStack_828;
  auVar124._28_4_ = uStack_824;
  local_4a0 = vandps_avx(local_1e0,auVar124);
  auVar188 = vsqrtss_avx(local_930,local_930);
  local_b04 = auVar188._0_4_;
  auVar188 = vsqrtss_avx(local_930,local_930);
  local_b08 = auVar188._0_4_;
  local_8b0 = 0x3f80000000000000;
  uStack_8a8 = 0;
  uStack_6fc = local_700;
  uStack_6f8 = local_700;
  uStack_6f4 = local_700;
  local_6f0 = uVar92;
  uStack_6ec = uVar92;
  uStack_6e8 = uVar92;
  uStack_6e4 = uVar92;
  do {
    auVar62._8_8_ = uStack_8a8;
    auVar62._0_8_ = local_8b0;
    auVar188 = vmovshdup_avx(auVar62);
    fVar244 = (float)local_8b0;
    fVar233 = auVar188._0_4_ - fVar244;
    fVar102 = fVar233 * 0.04761905;
    local_8e0._4_4_ = fVar244;
    local_8e0._0_4_ = fVar244;
    local_8e0._8_4_ = fVar244;
    local_8e0._12_4_ = fVar244;
    local_8e0._16_4_ = fVar244;
    local_8e0._20_4_ = fVar244;
    local_8e0._24_4_ = fVar244;
    local_8e0._28_4_ = fVar244;
    local_740._4_4_ = fVar233;
    local_740._0_4_ = fVar233;
    local_740._8_4_ = fVar233;
    local_740._12_4_ = fVar233;
    local_740._16_4_ = fVar233;
    local_740._20_4_ = fVar233;
    local_740._24_4_ = fVar233;
    local_740._28_4_ = fVar233;
    auVar188 = vfmadd231ps_fma(local_8e0,local_740,_DAT_02020f20);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = &DAT_3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar117 = vsubps_avx(auVar118,ZEXT1632(auVar188));
    fVar215 = auVar188._0_4_;
    fVar295 = auVar188._4_4_;
    fVar212 = auVar188._8_4_;
    fVar213 = auVar188._12_4_;
    fVar233 = auVar117._0_4_;
    fVar244 = auVar117._4_4_;
    fVar245 = auVar117._8_4_;
    fVar246 = auVar117._12_4_;
    fVar214 = auVar117._16_4_;
    fVar247 = auVar117._20_4_;
    fVar248 = auVar117._24_4_;
    auVar243._28_36_ = auVar242._28_36_;
    auVar243._0_28_ =
         ZEXT1628(CONCAT412(fVar213 * fVar213,
                            CONCAT48(fVar212 * fVar212,CONCAT44(fVar295 * fVar295,fVar215 * fVar215)
                                    )));
    fVar249 = fVar215 * 3.0;
    fVar262 = fVar295 * 3.0;
    fVar263 = fVar212 * 3.0;
    fVar264 = fVar213 * 3.0;
    fVar279 = auVar261._28_4_ + -5.0;
    auVar283._0_4_ = fVar233 * fVar233;
    auVar283._4_4_ = fVar244 * fVar244;
    auVar283._8_4_ = fVar245 * fVar245;
    auVar283._12_4_ = fVar246 * fVar246;
    auVar283._16_4_ = fVar214 * fVar214;
    auVar283._20_4_ = fVar247 * fVar247;
    auVar283._28_36_ = auVar282._28_36_;
    auVar283._24_4_ = fVar248 * fVar248;
    fVar202 = auVar117._28_4_;
    auVar282._0_4_ = (auVar283._0_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar282._4_4_ = (auVar283._4_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar282._8_4_ = (auVar283._8_4_ * (fVar245 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar282._12_4_ = (auVar283._12_4_ * (fVar246 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar282._16_4_ = (auVar283._16_4_ * (fVar214 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar282._20_4_ = (auVar283._20_4_ * (fVar247 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar282._28_36_ = auVar300._28_36_;
    auVar282._24_4_ = (auVar283._24_4_ * (fVar248 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar117 = auVar282._0_32_;
    fVar216 = fVar215 * fVar215 * (float)((uint)fVar233 ^ local_5e0) * 0.5;
    fVar225 = fVar295 * fVar295 * (float)((uint)fVar244 ^ uStack_5dc) * 0.5;
    fVar226 = fVar212 * fVar212 * (float)((uint)fVar245 ^ uStack_5d8) * 0.5;
    fVar227 = fVar213 * fVar213 * (float)((uint)fVar246 ^ uStack_5d4) * 0.5;
    fVar228 = (float)((uint)fVar214 ^ (uint)fStack_5d0) * 0.0 * 0.0 * 0.5;
    fVar229 = (float)((uint)fVar247 ^ (uint)fStack_5cc) * 0.0 * 0.0 * 0.5;
    fVar230 = (float)((uint)fVar248 ^ (uint)fStack_5c8) * 0.0 * 0.0 * 0.5;
    auVar9._4_4_ = fStack_1fc * fVar225;
    auVar9._0_4_ = local_200 * fVar216;
    auVar9._8_4_ = fStack_1f8 * fVar226;
    auVar9._12_4_ = fStack_1f4 * fVar227;
    auVar9._16_4_ = fStack_1f0 * fVar228;
    auVar9._20_4_ = fStack_1ec * fVar229;
    auVar9._24_4_ = fStack_1e8 * fVar230;
    auVar9._28_4_ = (uint)fVar202 ^ uStack_5c4;
    auVar242._0_4_ = fVar216 * (float)local_3e0;
    auVar242._4_4_ = fVar225 * local_3e0._4_4_;
    auVar242._8_4_ = fVar226 * (float)uStack_3d8;
    auVar242._12_4_ = fVar227 * uStack_3d8._4_4_;
    auVar242._16_4_ = fVar228 * (float)uStack_3d0;
    auVar242._20_4_ = fVar229 * uStack_3d0._4_4_;
    auVar242._28_36_ = auVar201._28_36_;
    auVar242._24_4_ = fVar230 * (float)uStack_3c8;
    auVar7._4_4_ = fVar225 * local_400._4_4_;
    auVar7._0_4_ = fVar216 * (float)local_400;
    auVar7._8_4_ = fVar226 * (float)uStack_3f8;
    auVar7._12_4_ = fVar227 * uStack_3f8._4_4_;
    auVar7._16_4_ = fVar228 * (float)uStack_3f0;
    auVar7._20_4_ = fVar229 * uStack_3f0._4_4_;
    auVar7._24_4_ = fVar230 * (float)uStack_3e8;
    auVar7._28_4_ = 0x40000000;
    auVar10._4_4_ = fVar225 * local_420._4_4_;
    auVar10._0_4_ = fVar216 * (float)local_420;
    auVar10._8_4_ = fVar226 * (float)uStack_418;
    auVar10._12_4_ = fVar227 * uStack_418._4_4_;
    auVar10._16_4_ = fVar228 * (float)uStack_410;
    auVar10._20_4_ = fVar229 * uStack_410._4_4_;
    auVar10._24_4_ = fVar230 * (float)uStack_408;
    auVar10._28_4_ = uStack_5c4;
    auVar69._4_4_ = uStack_47c;
    auVar69._0_4_ = local_480;
    auVar69._8_4_ = uStack_478;
    auVar69._12_4_ = uStack_474;
    auVar69._16_4_ = uStack_470;
    auVar69._20_4_ = uStack_46c;
    auVar69._24_4_ = uStack_468;
    auVar69._28_4_ = uStack_464;
    auVar188 = vfmadd231ps_fma(auVar9,auVar117,auVar69);
    auVar79._8_8_ = uStack_378;
    auVar79._0_8_ = local_380;
    auVar79._16_8_ = uStack_370;
    auVar79._24_8_ = uStack_368;
    auVar112 = vfmadd231ps_fma(auVar242._0_32_,auVar117,auVar79);
    auVar77._8_8_ = uStack_398;
    auVar77._0_8_ = local_3a0;
    auVar77._16_8_ = uStack_390;
    auVar77._24_8_ = uStack_388;
    auVar286 = vfmadd231ps_fma(auVar7,auVar117,auVar77);
    auVar75._8_8_ = uStack_3b8;
    auVar75._0_8_ = local_3c0;
    auVar75._16_8_ = uStack_3b0;
    auVar75._24_8_ = uStack_3a8;
    auVar6 = vfmadd231ps_fma(auVar10,auVar117,auVar75);
    auVar120._4_4_ = fVar244 * fVar244 * (float)((uint)fVar295 ^ uStack_5dc) * 0.5;
    auVar120._0_4_ = fVar233 * fVar233 * (float)((uint)fVar215 ^ local_5e0) * 0.5;
    auVar120._8_4_ = fVar245 * fVar245 * (float)((uint)fVar212 ^ uStack_5d8) * 0.5;
    auVar120._12_4_ = fVar246 * fVar246 * (float)((uint)fVar213 ^ uStack_5d4) * 0.5;
    auVar120._16_4_ = fVar214 * fVar214 * fStack_5d0 * 0.5;
    auVar120._20_4_ = fVar247 * fVar247 * fStack_5cc * 0.5;
    auVar120._24_4_ = fVar248 * fVar248 * fStack_5c8 * 0.5;
    auVar120._28_4_ = auVar294._28_4_;
    auVar271._4_4_ = ((fVar262 + -5.0) * fVar295 * fVar295 + 2.0) * 0.5;
    auVar271._0_4_ = ((fVar249 + -5.0) * fVar215 * fVar215 + 2.0) * 0.5;
    auVar271._8_4_ = ((fVar263 + -5.0) * fVar212 * fVar212 + 2.0) * 0.5;
    auVar271._12_4_ = ((fVar264 + -5.0) * fVar213 * fVar213 + 2.0) * 0.5;
    auVar271._16_4_ = 0x3f800000;
    auVar271._20_4_ = 0x3f800000;
    auVar271._24_4_ = 0x3f800000;
    auVar271._28_4_ = auVar300._28_4_ + 2.0;
    auVar71._4_4_ = uStack_45c;
    auVar71._0_4_ = local_460;
    auVar71._8_4_ = uStack_458;
    auVar71._12_4_ = uStack_454;
    auVar71._16_4_ = uStack_450;
    auVar71._20_4_ = uStack_44c;
    auVar71._24_4_ = uStack_448;
    auVar71._28_4_ = uStack_444;
    auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar271,auVar71);
    auVar90._8_8_ = uStack_1b8;
    auVar90._0_8_ = local_1c0;
    auVar90._16_8_ = uStack_1b0;
    auVar90._24_8_ = uStack_1a8;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar271,auVar90);
    auVar83._8_8_ = uStack_338;
    auVar83._0_8_ = local_340;
    auVar83._16_8_ = uStack_330;
    auVar83._24_8_ = uStack_328;
    auVar286 = vfmadd231ps_fma(ZEXT1632(auVar286),auVar271,auVar83);
    auVar81._8_8_ = uStack_358;
    auVar81._0_8_ = local_360;
    auVar81._16_8_ = uStack_350;
    auVar81._24_8_ = uStack_348;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar271,auVar81);
    auVar73._4_4_ = uStack_43c;
    auVar73._0_4_ = local_440;
    auVar73._8_4_ = uStack_438;
    auVar73._12_4_ = uStack_434;
    auVar73._16_4_ = uStack_430;
    auVar73._20_4_ = uStack_42c;
    auVar73._24_4_ = uStack_428;
    auVar73._28_4_ = uStack_424;
    auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar120,auVar73);
    auVar91._8_8_ = uStack_198;
    auVar91._0_8_ = local_1a0;
    auVar91._16_8_ = uStack_190;
    auVar91._24_8_ = uStack_188;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar120,auVar91);
    auVar87._8_8_ = uStack_2f8;
    auVar87._0_8_ = local_300;
    auVar87._16_8_ = uStack_2f0;
    auVar87._24_8_ = uStack_2e8;
    auVar286 = vfmadd231ps_fma(ZEXT1632(auVar286),auVar120,auVar87);
    auVar85._8_8_ = uStack_318;
    auVar85._0_8_ = local_320;
    auVar85._16_8_ = uStack_310;
    auVar85._24_8_ = uStack_308;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar120,auVar85);
    auVar240._4_4_ = (fVar244 + fVar244) * fVar295;
    auVar240._0_4_ = (fVar233 + fVar233) * fVar215;
    auVar240._8_4_ = (fVar245 + fVar245) * fVar212;
    auVar240._12_4_ = (fVar246 + fVar246) * fVar213;
    auVar240._16_4_ = (fVar214 + fVar214) * 0.0;
    auVar240._20_4_ = (fVar247 + fVar247) * 0.0;
    auVar240._24_4_ = (fVar248 + fVar248) * 0.0;
    auVar240._28_4_ = 0;
    auVar117 = vsubps_avx(auVar240,auVar283._0_32_);
    fVar225 = fVar279 + 0.0;
    fVar216 = auVar261._28_4_ + 2.0;
    auVar11._4_4_ = (fVar244 + fVar244) * (fVar262 + 2.0);
    auVar11._0_4_ = (fVar233 + fVar233) * (fVar249 + 2.0);
    auVar11._8_4_ = (fVar245 + fVar245) * (fVar263 + 2.0);
    auVar11._12_4_ = (fVar246 + fVar246) * (fVar264 + 2.0);
    auVar11._16_4_ = (fVar214 + fVar214) * 2.0;
    auVar11._20_4_ = (fVar247 + fVar247) * 2.0;
    auVar11._24_4_ = (fVar248 + fVar248) * 2.0;
    auVar11._28_4_ = fVar216;
    auVar146._4_4_ = fVar244 * fVar244 * 3.0;
    auVar146._0_4_ = fVar233 * fVar233 * 3.0;
    auVar146._8_4_ = fVar245 * fVar245 * 3.0;
    auVar146._12_4_ = fVar246 * fVar246 * 3.0;
    auVar146._16_4_ = fVar214 * fVar214 * 3.0;
    auVar146._20_4_ = fVar247 * fVar247 * 3.0;
    auVar146._24_4_ = fVar248 * fVar248 * 3.0;
    auVar146._28_4_ = fVar202;
    auVar124 = vsubps_avx(auVar11,auVar146);
    auVar9 = vsubps_avx(auVar243._0_32_,auVar240);
    auVar223._4_4_ = auVar117._4_4_ * 0.5;
    auVar223._0_4_ = auVar117._0_4_ * 0.5;
    auVar223._8_4_ = auVar117._8_4_ * 0.5;
    auVar223._12_4_ = auVar117._12_4_ * 0.5;
    auVar223._16_4_ = auVar117._16_4_ * 0.5;
    auVar223._20_4_ = auVar117._20_4_ * 0.5;
    auVar223._24_4_ = auVar117._24_4_ * 0.5;
    auVar223._28_4_ = fVar216;
    auVar270._28_4_ = fVar225;
    auVar270._0_28_ =
         ZEXT1628(CONCAT412(((fVar213 + fVar213) * (fVar264 + -5.0) + fVar264 * fVar213) * 0.5,
                            CONCAT48(((fVar212 + fVar212) * (fVar263 + -5.0) + fVar263 * fVar212) *
                                     0.5,CONCAT44(((fVar295 + fVar295) * (fVar262 + -5.0) +
                                                  fVar262 * fVar295) * 0.5,
                                                  ((fVar215 + fVar215) * (fVar249 + -5.0) +
                                                  fVar249 * fVar215) * 0.5))));
    auVar275._4_4_ = auVar124._4_4_ * 0.5;
    auVar275._0_4_ = auVar124._0_4_ * 0.5;
    auVar275._8_4_ = auVar124._8_4_ * 0.5;
    auVar275._12_4_ = auVar124._12_4_ * 0.5;
    auVar275._16_4_ = auVar124._16_4_ * 0.5;
    auVar275._20_4_ = auVar124._20_4_ * 0.5;
    fVar214 = auVar124._28_4_;
    auVar275._24_4_ = auVar124._24_4_ * 0.5;
    auVar275._28_4_ = fVar214;
    fVar233 = auVar9._0_4_ * 0.5;
    fVar244 = auVar9._4_4_ * 0.5;
    fVar245 = auVar9._8_4_ * 0.5;
    fVar246 = auVar9._12_4_ * 0.5;
    fVar247 = auVar9._16_4_ * 0.5;
    fVar248 = auVar9._20_4_ * 0.5;
    fVar216 = auVar9._24_4_ * 0.5;
    auVar239._4_4_ = fStack_1fc * fVar244;
    auVar239._0_4_ = local_200 * fVar233;
    auVar239._8_4_ = fStack_1f8 * fVar245;
    auVar239._12_4_ = fStack_1f4 * fVar246;
    auVar239._16_4_ = fStack_1f0 * fVar247;
    auVar239._20_4_ = fStack_1ec * fVar248;
    auVar239._24_4_ = fStack_1e8 * fVar216;
    auVar239._28_4_ = fStack_1e4;
    auVar309._4_4_ = fVar244 * local_3e0._4_4_;
    auVar309._0_4_ = fVar233 * (float)local_3e0;
    auVar309._8_4_ = fVar245 * (float)uStack_3d8;
    auVar309._12_4_ = fVar246 * uStack_3d8._4_4_;
    auVar309._16_4_ = fVar247 * (float)uStack_3d0;
    auVar309._20_4_ = fVar248 * uStack_3d0._4_4_;
    auVar309._24_4_ = fVar216 * (float)uStack_3c8;
    auVar309._28_4_ = fVar279;
    auVar8._4_4_ = fVar244 * local_400._4_4_;
    auVar8._0_4_ = fVar233 * (float)local_400;
    auVar8._8_4_ = fVar245 * (float)uStack_3f8;
    auVar8._12_4_ = fVar246 * uStack_3f8._4_4_;
    auVar8._16_4_ = fVar247 * (float)uStack_3f0;
    auVar8._20_4_ = fVar248 * uStack_3f0._4_4_;
    auVar8._24_4_ = fVar216 * (float)uStack_3e8;
    auVar8._28_4_ = auVar117._28_4_;
    auVar13._4_4_ = fVar244 * local_420._4_4_;
    auVar13._0_4_ = fVar233 * (float)local_420;
    auVar13._8_4_ = fVar245 * (float)uStack_418;
    auVar13._12_4_ = fVar246 * uStack_418._4_4_;
    auVar13._16_4_ = fVar247 * (float)uStack_410;
    auVar13._20_4_ = fVar248 * uStack_410._4_4_;
    auVar13._24_4_ = fVar216 * (float)uStack_408;
    auVar13._28_4_ = auVar9._28_4_;
    auVar70._4_4_ = uStack_47c;
    auVar70._0_4_ = local_480;
    auVar70._8_4_ = uStack_478;
    auVar70._12_4_ = uStack_474;
    auVar70._16_4_ = uStack_470;
    auVar70._20_4_ = uStack_46c;
    auVar70._24_4_ = uStack_468;
    auVar70._28_4_ = uStack_464;
    auVar235 = vfmadd231ps_fma(auVar239,auVar275,auVar70);
    auVar80._8_8_ = uStack_378;
    auVar80._0_8_ = local_380;
    auVar80._16_8_ = uStack_370;
    auVar80._24_8_ = uStack_368;
    auVar141 = vfmadd231ps_fma(auVar309,auVar275,auVar80);
    auVar78._8_8_ = uStack_398;
    auVar78._0_8_ = local_3a0;
    auVar78._16_8_ = uStack_390;
    auVar78._24_8_ = uStack_388;
    auVar106 = vfmadd231ps_fma(auVar8,auVar275,auVar78);
    auVar76._8_8_ = uStack_3b8;
    auVar76._0_8_ = local_3c0;
    auVar76._16_8_ = uStack_3b0;
    auVar76._24_8_ = uStack_3a8;
    auVar105 = vfmadd231ps_fma(auVar13,auVar275,auVar76);
    auVar72._4_4_ = uStack_45c;
    auVar72._0_4_ = local_460;
    auVar72._8_4_ = uStack_458;
    auVar72._12_4_ = uStack_454;
    auVar72._16_4_ = uStack_450;
    auVar72._20_4_ = uStack_44c;
    auVar72._24_4_ = uStack_448;
    auVar72._28_4_ = uStack_444;
    auVar235 = vfmadd231ps_fma(ZEXT1632(auVar235),auVar270,auVar72);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar270,auVar90);
    auVar84._8_8_ = uStack_338;
    auVar84._0_8_ = local_340;
    auVar84._16_8_ = uStack_330;
    auVar84._24_8_ = uStack_328;
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar270,auVar84);
    auVar82._8_8_ = uStack_358;
    auVar82._0_8_ = local_360;
    auVar82._16_8_ = uStack_350;
    auVar82._24_8_ = uStack_348;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar270,auVar82);
    auVar74._4_4_ = uStack_43c;
    auVar74._0_4_ = local_440;
    auVar74._8_4_ = uStack_438;
    auVar74._12_4_ = uStack_434;
    auVar74._16_4_ = uStack_430;
    auVar74._20_4_ = uStack_42c;
    auVar74._24_4_ = uStack_428;
    auVar74._28_4_ = uStack_424;
    auVar235 = vfmadd231ps_fma(ZEXT1632(auVar235),auVar223,auVar74);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar223,auVar91);
    auVar88._8_8_ = uStack_2f8;
    auVar88._0_8_ = local_300;
    auVar88._16_8_ = uStack_2f0;
    auVar88._24_8_ = uStack_2e8;
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar223,auVar88);
    auVar86._8_8_ = uStack_318;
    auVar86._0_8_ = local_320;
    auVar86._16_8_ = uStack_310;
    auVar86._24_8_ = uStack_308;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar223,auVar86);
    auVar267._0_4_ = auVar235._0_4_ * fVar102;
    auVar267._4_4_ = auVar235._4_4_ * fVar102;
    auVar267._8_4_ = auVar235._8_4_ * fVar102;
    auVar267._12_4_ = auVar235._12_4_ * fVar102;
    auVar267._16_4_ = fVar102 * 0.0;
    auVar267._20_4_ = fVar102 * 0.0;
    auVar267._24_4_ = fVar102 * 0.0;
    auVar267._28_4_ = 0;
    fVar244 = auVar141._0_4_ * fVar102;
    fVar246 = auVar141._4_4_ * fVar102;
    local_720._4_4_ = fVar246;
    local_720._0_4_ = fVar244;
    fVar248 = auVar141._8_4_ * fVar102;
    local_720._8_4_ = fVar248;
    fVar228 = auVar141._12_4_ * fVar102;
    local_720._12_4_ = fVar228;
    local_720._16_4_ = fVar102 * 0.0;
    local_720._20_4_ = fVar102 * 0.0;
    local_720._24_4_ = fVar102 * 0.0;
    local_720._28_4_ = fVar202 + fVar202;
    local_a00._0_4_ = auVar106._0_4_ * fVar102;
    local_a00._4_4_ = auVar106._4_4_ * fVar102;
    local_a00._8_4_ = auVar106._8_4_ * fVar102;
    local_a00._12_4_ = auVar106._12_4_ * fVar102;
    local_a00._16_4_ = fVar102 * 0.0;
    local_a00._20_4_ = fVar102 * 0.0;
    local_a00._24_4_ = fVar102 * 0.0;
    local_a00._28_4_ = 0;
    fVar202 = fVar102 * auVar105._0_4_;
    fVar226 = fVar102 * auVar105._4_4_;
    auVar14._4_4_ = fVar226;
    auVar14._0_4_ = fVar202;
    fVar212 = fVar102 * auVar105._8_4_;
    auVar14._8_4_ = fVar212;
    fVar213 = fVar102 * auVar105._12_4_;
    auVar14._12_4_ = fVar213;
    auVar14._16_4_ = fVar102 * 0.0;
    auVar14._20_4_ = fVar102 * 0.0;
    auVar14._24_4_ = fVar102 * 0.0;
    auVar14._28_4_ = fVar214;
    auVar146 = ZEXT1632(auVar188);
    auVar240 = vpermps_avx2(_DAT_0205d4a0,auVar146);
    auVar223 = ZEXT1632(auVar112);
    _local_960 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar112));
    local_980 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar286));
    local_560 = vsubps_avx(auVar240,ZEXT1632(auVar188));
    auVar10 = vsubps_avx(local_980,ZEXT1632(auVar286));
    fVar233 = auVar10._0_4_;
    fVar245 = auVar10._4_4_;
    auVar15._4_4_ = auVar267._4_4_ * fVar245;
    auVar15._0_4_ = auVar267._0_4_ * fVar233;
    fVar247 = auVar10._8_4_;
    auVar15._8_4_ = auVar267._8_4_ * fVar247;
    fVar216 = auVar10._12_4_;
    auVar15._12_4_ = auVar267._12_4_ * fVar216;
    fVar227 = auVar10._16_4_;
    auVar15._16_4_ = auVar267._16_4_ * fVar227;
    fVar229 = auVar10._20_4_;
    auVar15._20_4_ = auVar267._20_4_ * fVar229;
    fVar215 = auVar10._24_4_;
    auVar15._24_4_ = auVar267._24_4_ * fVar215;
    auVar15._28_4_ = fVar225;
    auVar188 = vfmsub231ps_fma(auVar15,local_a00,local_560);
    local_580 = vsubps_avx(_local_960,auVar223);
    fVar296 = local_560._0_4_;
    fVar301 = local_560._4_4_;
    auVar16._4_4_ = fVar301 * fVar246;
    auVar16._0_4_ = fVar296 * fVar244;
    fVar302 = local_560._8_4_;
    auVar16._8_4_ = fVar302 * fVar248;
    fVar303 = local_560._12_4_;
    auVar16._12_4_ = fVar303 * fVar228;
    fVar304 = local_560._16_4_;
    auVar16._16_4_ = fVar304 * fVar102 * 0.0;
    fVar305 = local_560._20_4_;
    auVar16._20_4_ = fVar305 * fVar102 * 0.0;
    fVar306 = local_560._24_4_;
    auVar16._24_4_ = fVar306 * fVar102 * 0.0;
    auVar16._28_4_ = auVar240._28_4_;
    auVar112 = vfmsub231ps_fma(auVar16,auVar267,local_580);
    auVar188 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar112._12_4_ * auVar112._12_4_,
                                                  CONCAT48(auVar112._8_4_ * auVar112._8_4_,
                                                           CONCAT44(auVar112._4_4_ * auVar112._4_4_,
                                                                    auVar112._0_4_ * auVar112._0_4_)
                                                          ))),ZEXT1632(auVar188),ZEXT1632(auVar188))
    ;
    fVar262 = local_580._0_4_;
    fVar263 = local_580._4_4_;
    auVar17._4_4_ = fVar263 * local_a00._4_4_;
    auVar17._0_4_ = fVar262 * (float)local_a00._0_4_;
    fVar264 = local_580._8_4_;
    auVar17._8_4_ = fVar264 * local_a00._8_4_;
    fVar279 = local_580._12_4_;
    auVar17._12_4_ = fVar279 * local_a00._12_4_;
    fVar276 = local_580._16_4_;
    auVar17._16_4_ = fVar276 * local_a00._16_4_;
    fVar277 = local_580._20_4_;
    auVar17._20_4_ = fVar277 * local_a00._20_4_;
    fVar278 = local_580._24_4_;
    auVar17._24_4_ = fVar278 * local_a00._24_4_;
    auVar17._28_4_ = local_960._28_4_;
    auVar235 = vfmsub231ps_fma(auVar17,local_720,auVar10);
    auVar232._0_4_ = fVar233 * fVar233;
    auVar232._4_4_ = fVar245 * fVar245;
    auVar232._8_4_ = fVar247 * fVar247;
    auVar232._12_4_ = fVar216 * fVar216;
    auVar232._16_4_ = fVar227 * fVar227;
    auVar232._20_4_ = fVar229 * fVar229;
    auVar232._24_4_ = fVar215 * fVar215;
    auVar232._28_4_ = 0;
    auVar112 = vfmadd231ps_fma(auVar232,local_580,local_580);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),local_560,local_560);
    auVar117 = vrcpps_avx(ZEXT1632(auVar112));
    auVar235 = vfmadd231ps_fma(ZEXT1632(auVar188),ZEXT1632(auVar235),ZEXT1632(auVar235));
    auVar147._8_4_ = 0x3f800000;
    auVar147._0_8_ = &DAT_3f8000003f800000;
    auVar147._12_4_ = 0x3f800000;
    auVar147._16_4_ = 0x3f800000;
    auVar147._20_4_ = 0x3f800000;
    auVar147._24_4_ = 0x3f800000;
    auVar147._28_4_ = 0x3f800000;
    auVar188 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar112),auVar147);
    auVar188 = vfmadd132ps_fma(ZEXT1632(auVar188),auVar117,auVar117);
    local_ac0 = vpermps_avx2(_DAT_0205d4a0,auVar267);
    local_9a0 = vpermps_avx2(_DAT_0205d4a0,local_a00);
    auVar18._4_4_ = local_ac0._4_4_ * fVar245;
    auVar18._0_4_ = local_ac0._0_4_ * fVar233;
    auVar18._8_4_ = local_ac0._8_4_ * fVar247;
    auVar18._12_4_ = local_ac0._12_4_ * fVar216;
    auVar18._16_4_ = local_ac0._16_4_ * fVar227;
    auVar18._20_4_ = local_ac0._20_4_ * fVar229;
    auVar18._24_4_ = local_ac0._24_4_ * fVar215;
    auVar18._28_4_ = auVar117._28_4_;
    auVar141 = vfmsub231ps_fma(auVar18,local_9a0,local_560);
    local_9c0 = vpermps_avx2(_DAT_0205d4a0,local_720);
    auVar19._4_4_ = fVar301 * local_9c0._4_4_;
    auVar19._0_4_ = fVar296 * local_9c0._0_4_;
    auVar19._8_4_ = fVar302 * local_9c0._8_4_;
    auVar19._12_4_ = fVar303 * local_9c0._12_4_;
    auVar19._16_4_ = fVar304 * local_9c0._16_4_;
    auVar19._20_4_ = fVar305 * local_9c0._20_4_;
    auVar19._24_4_ = fVar306 * local_9c0._24_4_;
    auVar19._28_4_ = 0;
    auVar106 = vfmsub231ps_fma(auVar19,local_ac0,local_580);
    auVar141 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar106._12_4_ * auVar106._12_4_,
                                                  CONCAT48(auVar106._8_4_ * auVar106._8_4_,
                                                           CONCAT44(auVar106._4_4_ * auVar106._4_4_,
                                                                    auVar106._0_4_ * auVar106._0_4_)
                                                          ))),ZEXT1632(auVar141),ZEXT1632(auVar141))
    ;
    fVar244 = local_9a0._0_4_;
    auVar253._0_4_ = fVar262 * fVar244;
    fVar246 = local_9a0._4_4_;
    auVar253._4_4_ = fVar263 * fVar246;
    fVar248 = local_9a0._8_4_;
    auVar253._8_4_ = fVar264 * fVar248;
    fVar225 = local_9a0._12_4_;
    auVar253._12_4_ = fVar279 * fVar225;
    fVar228 = local_9a0._16_4_;
    auVar253._16_4_ = fVar276 * fVar228;
    fVar230 = local_9a0._20_4_;
    auVar253._20_4_ = fVar277 * fVar230;
    fVar295 = local_9a0._24_4_;
    auVar253._24_4_ = fVar278 * fVar295;
    auVar253._28_4_ = 0;
    auVar106 = vfmsub231ps_fma(auVar253,local_9c0,auVar10);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar106),ZEXT1632(auVar106));
    auVar117 = vmaxps_avx(ZEXT1632(CONCAT412(auVar235._12_4_ * auVar188._12_4_,
                                             CONCAT48(auVar235._8_4_ * auVar188._8_4_,
                                                      CONCAT44(auVar235._4_4_ * auVar188._4_4_,
                                                               auVar235._0_4_ * auVar188._0_4_)))),
                          ZEXT1632(CONCAT412(auVar141._12_4_ * auVar188._12_4_,
                                             CONCAT48(auVar141._8_4_ * auVar188._8_4_,
                                                      CONCAT44(auVar141._4_4_ * auVar188._4_4_,
                                                               auVar141._0_4_ * auVar188._0_4_)))));
    auVar254._0_4_ = auVar6._0_4_ + fVar202;
    auVar254._4_4_ = auVar6._4_4_ + fVar226;
    auVar254._8_4_ = auVar6._8_4_ + fVar212;
    auVar254._12_4_ = auVar6._12_4_ + fVar213;
    auVar254._16_4_ = fVar102 * 0.0 + 0.0;
    auVar254._20_4_ = fVar102 * 0.0 + 0.0;
    auVar254._24_4_ = fVar102 * 0.0 + 0.0;
    auVar254._28_4_ = fVar214 + 0.0;
    local_760 = ZEXT1632(auVar6);
    auVar124 = vsubps_avx(local_760,auVar14);
    local_600 = vpermps_avx2(_DAT_0205d4a0,auVar124);
    auVar11 = vpermps_avx2(_DAT_0205d4a0,local_760);
    auVar124 = vmaxps_avx(local_760,auVar254);
    auVar9 = vmaxps_avx(local_600,auVar11);
    auVar7 = vrsqrtps_avx(ZEXT1632(auVar112));
    auVar9 = vmaxps_avx(auVar124,auVar9);
    uVar97 = auVar124._28_4_;
    fVar102 = auVar7._0_4_;
    fVar214 = auVar7._4_4_;
    fVar202 = auVar7._8_4_;
    fVar226 = auVar7._12_4_;
    fVar212 = auVar7._16_4_;
    fVar213 = auVar7._20_4_;
    fVar249 = auVar7._24_4_;
    auVar268._0_4_ = fVar102 * fVar102 * fVar102 * auVar112._0_4_ * -0.5;
    auVar268._4_4_ = fVar214 * fVar214 * fVar214 * auVar112._4_4_ * -0.5;
    auVar268._8_4_ = fVar202 * fVar202 * fVar202 * auVar112._8_4_ * -0.5;
    auVar268._12_4_ = fVar226 * fVar226 * fVar226 * auVar112._12_4_ * -0.5;
    auVar268._16_4_ = fVar212 * fVar212 * fVar212 * -0.0;
    auVar268._20_4_ = fVar213 * fVar213 * fVar213 * -0.0;
    auVar268._24_4_ = fVar249 * fVar249 * fVar249 * -0.0;
    auVar268._28_4_ = 0;
    auVar119._8_4_ = 0x3fc00000;
    auVar119._0_8_ = 0x3fc000003fc00000;
    auVar119._12_4_ = 0x3fc00000;
    auVar119._16_4_ = 0x3fc00000;
    auVar119._20_4_ = 0x3fc00000;
    auVar119._24_4_ = 0x3fc00000;
    auVar119._28_4_ = 0x3fc00000;
    auVar188 = vfmadd231ps_fma(auVar268,auVar119,auVar7);
    fVar102 = auVar188._0_4_;
    fVar214 = auVar188._4_4_;
    auVar20._4_4_ = fVar263 * fVar214;
    auVar20._0_4_ = fVar262 * fVar102;
    fVar202 = auVar188._8_4_;
    auVar20._8_4_ = fVar264 * fVar202;
    fVar226 = auVar188._12_4_;
    auVar20._12_4_ = fVar279 * fVar226;
    auVar20._16_4_ = fVar276 * 0.0;
    auVar20._20_4_ = fVar277 * 0.0;
    auVar20._24_4_ = fVar278 * 0.0;
    auVar20._28_4_ = uVar97;
    auVar21._4_4_ = (float)local_820._4_4_ * fVar214 * fVar245;
    auVar21._0_4_ = (float)local_820._0_4_ * fVar102 * fVar233;
    auVar21._8_4_ = fStack_818 * fVar202 * fVar247;
    auVar21._12_4_ = fStack_814 * fVar226 * fVar216;
    auVar21._16_4_ = fStack_810 * fVar227 * 0.0;
    auVar21._20_4_ = fStack_80c * fVar229 * 0.0;
    auVar21._24_4_ = fStack_808 * fVar215 * 0.0;
    auVar21._28_4_ = local_580._28_4_;
    auVar112 = vfmadd231ps_fma(auVar21,auVar20,_local_800);
    auVar294 = ZEXT864(0) << 0x20;
    local_540 = ZEXT1632(auVar286);
    auVar124 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    auVar282 = ZEXT3264(auVar124);
    fVar264 = auVar124._0_4_;
    auVar269._0_4_ = fVar264 * fVar102 * fVar233;
    fVar279 = auVar124._4_4_;
    auVar269._4_4_ = fVar279 * fVar214 * fVar245;
    fVar276 = auVar124._8_4_;
    auVar269._8_4_ = fVar276 * fVar202 * fVar247;
    fVar277 = auVar124._12_4_;
    auVar269._12_4_ = fVar277 * fVar226 * fVar216;
    fVar278 = auVar124._16_4_;
    auVar269._16_4_ = fVar278 * fVar227 * 0.0;
    fVar284 = auVar124._20_4_;
    auVar269._20_4_ = fVar284 * fVar229 * 0.0;
    fVar285 = auVar124._24_4_;
    auVar269._24_4_ = fVar285 * fVar215 * 0.0;
    auVar269._28_4_ = 0;
    auVar124 = vsubps_avx(ZEXT832(0) << 0x20,auVar223);
    auVar286 = vfmadd231ps_fma(auVar269,auVar124,auVar20);
    auVar22._4_4_ = fVar301 * fVar214;
    auVar22._0_4_ = fVar296 * fVar102;
    auVar22._8_4_ = fVar302 * fVar202;
    auVar22._12_4_ = fVar303 * fVar226;
    auVar22._16_4_ = fVar304 * 0.0;
    auVar22._20_4_ = fVar305 * 0.0;
    auVar22._24_4_ = fVar306 * 0.0;
    auVar22._28_4_ = uVar97;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar22,_local_7c0);
    auVar239 = ZEXT832(0) << 0x20;
    auVar7 = vsubps_avx(auVar239,auVar146);
    auVar286 = vfmadd231ps_fma(ZEXT1632(auVar286),auVar7,auVar22);
    auVar23._4_4_ = (float)local_820._4_4_ * fVar279;
    auVar23._0_4_ = (float)local_820._0_4_ * fVar264;
    auVar23._8_4_ = fStack_818 * fVar276;
    auVar23._12_4_ = fStack_814 * fVar277;
    auVar23._16_4_ = fStack_810 * fVar278;
    auVar23._20_4_ = fStack_80c * fVar284;
    auVar23._24_4_ = fStack_808 * fVar285;
    auVar23._28_4_ = uVar97;
    auVar6 = vfmadd231ps_fma(auVar23,_local_800,auVar124);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_7c0,auVar7);
    fVar233 = auVar286._0_4_;
    fVar213 = auVar112._0_4_;
    fVar245 = auVar286._4_4_;
    fVar249 = auVar112._4_4_;
    fVar247 = auVar286._8_4_;
    fVar262 = auVar112._8_4_;
    fVar216 = auVar286._12_4_;
    fVar263 = auVar112._12_4_;
    auVar24._28_4_ = uStack_804;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar263 * fVar216,
                            CONCAT48(fVar262 * fVar247,CONCAT44(fVar249 * fVar245,fVar213 * fVar233)
                                    )));
    auVar120 = vsubps_avx(ZEXT1632(auVar6),auVar24);
    auVar25._4_4_ = fVar279 * fVar279;
    auVar25._0_4_ = fVar264 * fVar264;
    auVar25._8_4_ = fVar276 * fVar276;
    auVar25._12_4_ = fVar277 * fVar277;
    auVar25._16_4_ = fVar278 * fVar278;
    auVar25._20_4_ = fVar284 * fVar284;
    auVar25._24_4_ = fVar285 * fVar285;
    auVar25._28_4_ = uStack_804;
    auVar6 = vfmadd231ps_fma(auVar25,auVar124,auVar124);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar7,auVar7);
    auVar26._28_4_ = local_560._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar216,
                            CONCAT48(fVar247 * fVar247,CONCAT44(fVar245 * fVar245,fVar233 * fVar233)
                                    )));
    auVar300 = ZEXT3264(auVar26);
    auVar271 = vsubps_avx(ZEXT1632(auVar6),auVar26);
    _local_620 = vsqrtps_avx(auVar117);
    fVar212 = local_620._28_4_ + auVar9._28_4_;
    fVar233 = (local_620._0_4_ + auVar9._0_4_) * 1.0000002;
    fVar245 = (local_620._4_4_ + auVar9._4_4_) * 1.0000002;
    fVar247 = (local_620._8_4_ + auVar9._8_4_) * 1.0000002;
    fVar216 = (local_620._12_4_ + auVar9._12_4_) * 1.0000002;
    fVar227 = (local_620._16_4_ + auVar9._16_4_) * 1.0000002;
    fVar229 = (local_620._20_4_ + auVar9._20_4_) * 1.0000002;
    fVar215 = (local_620._24_4_ + auVar9._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar245 * fVar245;
    auVar27._0_4_ = fVar233 * fVar233;
    auVar27._8_4_ = fVar247 * fVar247;
    auVar27._12_4_ = fVar216 * fVar216;
    auVar27._16_4_ = fVar227 * fVar227;
    auVar27._20_4_ = fVar229 * fVar229;
    auVar27._24_4_ = fVar215 * fVar215;
    auVar27._28_4_ = fVar212;
    local_b00._0_4_ = auVar120._0_4_ + auVar120._0_4_;
    local_b00._4_4_ = auVar120._4_4_ + auVar120._4_4_;
    local_b00._8_4_ = auVar120._8_4_ + auVar120._8_4_;
    local_b00._12_4_ = auVar120._12_4_ + auVar120._12_4_;
    local_b00._16_4_ = auVar120._16_4_ + auVar120._16_4_;
    local_b00._20_4_ = auVar120._20_4_ + auVar120._20_4_;
    local_b00._24_4_ = auVar120._24_4_ + auVar120._24_4_;
    fVar233 = auVar120._28_4_;
    local_b00._28_4_ = fVar233 + fVar233;
    auVar9 = vsubps_avx(auVar271,auVar27);
    auVar242 = ZEXT3264(auVar9);
    auVar275 = ZEXT1632(auVar112);
    auVar309 = ZEXT1632(CONCAT412(fVar263 * fVar263,
                                  CONCAT48(fVar262 * fVar262,
                                           CONCAT44(fVar249 * fVar249,fVar213 * fVar213))));
    local_640 = vsubps_avx(local_1e0,auVar309);
    auVar28._4_4_ = local_b00._4_4_ * local_b00._4_4_;
    auVar28._0_4_ = (float)local_b00._0_4_ * (float)local_b00._0_4_;
    auVar28._8_4_ = local_b00._8_4_ * local_b00._8_4_;
    auVar28._12_4_ = local_b00._12_4_ * local_b00._12_4_;
    auVar28._16_4_ = local_b00._16_4_ * local_b00._16_4_;
    auVar28._20_4_ = local_b00._20_4_ * local_b00._20_4_;
    auVar28._24_4_ = local_b00._24_4_ * local_b00._24_4_;
    auVar28._28_4_ = fVar212;
    fVar245 = local_640._0_4_;
    local_520._0_4_ = fVar245 * 4.0;
    fVar247 = local_640._4_4_;
    local_520._4_4_ = fVar247 * 4.0;
    fVar216 = local_640._8_4_;
    fStack_518 = fVar216 * 4.0;
    fVar227 = local_640._12_4_;
    fStack_514 = fVar227 * 4.0;
    fVar229 = local_640._16_4_;
    fStack_510 = fVar229 * 4.0;
    fVar215 = local_640._20_4_;
    fStack_50c = fVar215 * 4.0;
    fVar212 = local_640._24_4_;
    fStack_508 = fVar212 * 4.0;
    uStack_504 = 0x40800000;
    auVar29._4_4_ = (float)local_520._4_4_ * auVar9._4_4_;
    auVar29._0_4_ = (float)local_520._0_4_ * auVar9._0_4_;
    auVar29._8_4_ = fStack_518 * auVar9._8_4_;
    auVar29._12_4_ = fStack_514 * auVar9._12_4_;
    auVar29._16_4_ = fStack_510 * auVar9._16_4_;
    auVar29._20_4_ = fStack_50c * auVar9._20_4_;
    auVar29._24_4_ = fStack_508 * auVar9._24_4_;
    auVar29._28_4_ = fVar233;
    auVar120 = vsubps_avx(auVar28,auVar29);
    auVar117 = vcmpps_avx(auVar120,auVar239,5);
    auVar270 = ZEXT1632(auVar286);
    fVar233 = local_640._28_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      local_ae0._8_4_ = 0x7f800000;
      local_ae0._0_8_ = 0x7f8000007f800000;
      local_ae0._12_4_ = 0x7f800000;
      local_ae0._16_4_ = 0x7f800000;
      local_ae0._20_4_ = 0x7f800000;
      local_ae0._24_4_ = 0x7f800000;
      local_ae0._28_4_ = 0x7f800000;
      auVar197._8_4_ = 0xff800000;
      auVar197._0_8_ = 0xff800000ff800000;
      auVar197._12_4_ = 0xff800000;
      auVar197._16_4_ = 0xff800000;
      auVar197._20_4_ = 0xff800000;
      auVar197._24_4_ = 0xff800000;
      auVar197._28_4_ = 0xff800000;
    }
    else {
      auVar239 = vcmpps_avx(auVar120,auVar239,5);
      auVar8 = vsqrtps_avx(auVar120);
      auVar297._0_4_ = fVar245 + fVar245;
      auVar297._4_4_ = fVar247 + fVar247;
      auVar297._8_4_ = fVar216 + fVar216;
      auVar297._12_4_ = fVar227 + fVar227;
      auVar297._16_4_ = fVar229 + fVar229;
      auVar297._20_4_ = fVar215 + fVar215;
      auVar297._24_4_ = fVar212 + fVar212;
      auVar297._28_4_ = fVar233 + fVar233;
      auVar120 = vrcpps_avx(auVar297);
      auVar209._8_4_ = 0x3f800000;
      auVar209._0_8_ = &DAT_3f8000003f800000;
      auVar209._12_4_ = 0x3f800000;
      auVar209._16_4_ = 0x3f800000;
      auVar209._20_4_ = 0x3f800000;
      auVar209._24_4_ = 0x3f800000;
      auVar209._28_4_ = 0x3f800000;
      auVar112 = vfnmadd213ps_fma(auVar297,auVar120,auVar209);
      auVar112 = vfmadd132ps_fma(ZEXT1632(auVar112),auVar120,auVar120);
      auVar289._0_4_ = local_b00._0_4_ ^ local_5e0;
      auVar289._4_4_ = (uint)local_b00._4_4_ ^ uStack_5dc;
      auVar289._8_4_ = (uint)local_b00._8_4_ ^ uStack_5d8;
      auVar289._12_4_ = (uint)local_b00._12_4_ ^ uStack_5d4;
      auVar289._16_4_ = (uint)local_b00._16_4_ ^ (uint)fStack_5d0;
      auVar289._20_4_ = (uint)local_b00._20_4_ ^ (uint)fStack_5cc;
      auVar289._24_4_ = (uint)local_b00._24_4_ ^ (uint)fStack_5c8;
      auVar289._28_4_ = (uint)local_b00._28_4_ ^ uStack_5c4;
      auVar120 = vsubps_avx(auVar289,auVar8);
      auVar30._4_4_ = auVar120._4_4_ * auVar112._4_4_;
      auVar30._0_4_ = auVar120._0_4_ * auVar112._0_4_;
      auVar30._8_4_ = auVar120._8_4_ * auVar112._8_4_;
      auVar30._12_4_ = auVar120._12_4_ * auVar112._12_4_;
      auVar30._16_4_ = auVar120._16_4_ * 0.0;
      auVar30._20_4_ = auVar120._20_4_ * 0.0;
      auVar30._24_4_ = auVar120._24_4_ * 0.0;
      auVar30._28_4_ = auVar120._28_4_;
      auVar120 = vsubps_avx(auVar8,local_b00);
      auVar31._4_4_ = auVar112._4_4_ * auVar120._4_4_;
      auVar31._0_4_ = auVar112._0_4_ * auVar120._0_4_;
      auVar31._8_4_ = auVar112._8_4_ * auVar120._8_4_;
      auVar31._12_4_ = auVar112._12_4_ * auVar120._12_4_;
      auVar31._16_4_ = auVar120._16_4_ * 0.0;
      auVar31._20_4_ = auVar120._20_4_ * 0.0;
      auVar31._24_4_ = auVar120._24_4_ * 0.0;
      auVar31._28_4_ = auVar120._28_4_;
      auVar112 = vfmadd213ps_fma(auVar275,auVar30,auVar270);
      local_4e0 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar226,
                                     CONCAT48(auVar112._8_4_ * fVar202,
                                              CONCAT44(auVar112._4_4_ * fVar214,
                                                       auVar112._0_4_ * fVar102))));
      auVar112 = vfmadd213ps_fma(auVar275,auVar31,auVar270);
      local_500 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar226,
                                     CONCAT48(auVar112._8_4_ * fVar202,
                                              CONCAT44(auVar112._4_4_ * fVar214,
                                                       auVar112._0_4_ * fVar102))));
      auVar148._8_4_ = 0x7f800000;
      auVar148._0_8_ = 0x7f8000007f800000;
      auVar148._12_4_ = 0x7f800000;
      auVar148._16_4_ = 0x7f800000;
      auVar148._20_4_ = 0x7f800000;
      auVar148._24_4_ = 0x7f800000;
      auVar148._28_4_ = 0x7f800000;
      local_ae0 = vblendvps_avx(auVar148,auVar30,auVar239);
      auVar64._4_4_ = uStack_83c;
      auVar64._0_4_ = local_840;
      auVar64._8_4_ = uStack_838;
      auVar64._12_4_ = uStack_834;
      auVar64._16_4_ = uStack_830;
      auVar64._20_4_ = uStack_82c;
      auVar64._24_4_ = uStack_828;
      auVar64._28_4_ = uStack_824;
      auVar120 = vandps_avx(auVar309,auVar64);
      auVar120 = vmaxps_avx(local_4a0,auVar120);
      auVar32._4_4_ = auVar120._4_4_ * 1.9073486e-06;
      auVar32._0_4_ = auVar120._0_4_ * 1.9073486e-06;
      auVar32._8_4_ = auVar120._8_4_ * 1.9073486e-06;
      auVar32._12_4_ = auVar120._12_4_ * 1.9073486e-06;
      auVar32._16_4_ = auVar120._16_4_ * 1.9073486e-06;
      auVar32._20_4_ = auVar120._20_4_ * 1.9073486e-06;
      auVar32._24_4_ = auVar120._24_4_ * 1.9073486e-06;
      auVar32._28_4_ = auVar120._28_4_;
      auVar294 = ZEXT3264(auVar32);
      auVar120 = vandps_avx(local_640,auVar64);
      auVar120 = vcmpps_avx(auVar120,auVar32,1);
      auVar300 = ZEXT3264(auVar120);
      auVar149._8_4_ = 0xff800000;
      auVar149._0_8_ = 0xff800000ff800000;
      auVar149._12_4_ = 0xff800000;
      auVar149._16_4_ = 0xff800000;
      auVar149._20_4_ = 0xff800000;
      auVar149._24_4_ = 0xff800000;
      auVar149._28_4_ = 0xff800000;
      auVar197 = vblendvps_avx(auVar149,auVar31,auVar239);
      auVar8 = auVar239 & auVar120;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar117 = vandps_avx(auVar120,auVar239);
        auVar120 = vcmpps_avx(auVar9,_DAT_02020f00,2);
        auVar242 = ZEXT3264(auVar120);
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
        auVar162._8_4_ = 0x7f800000;
        auVar162._0_8_ = 0x7f8000007f800000;
        auVar162._12_4_ = 0x7f800000;
        auVar162._16_4_ = 0x7f800000;
        auVar162._20_4_ = 0x7f800000;
        auVar162._24_4_ = 0x7f800000;
        auVar162._28_4_ = 0x7f800000;
        auVar9 = vblendvps_avx(auVar162,auVar126,auVar120);
        auVar112 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar8 = vpmovsxwd_avx2(auVar112);
        auVar294 = ZEXT3264(auVar8);
        local_ae0 = vblendvps_avx(local_ae0,auVar9,auVar8);
        auVar9 = vblendvps_avx(auVar126,auVar162,auVar120);
        auVar300 = ZEXT3264(auVar9);
        auVar197 = vblendvps_avx(auVar197,auVar9,auVar8);
        auVar211._0_8_ = auVar117._0_8_ ^ 0xffffffffffffffff;
        auVar211._8_4_ = auVar117._8_4_ ^ 0xffffffff;
        auVar211._12_4_ = auVar117._12_4_ ^ 0xffffffff;
        auVar211._16_4_ = auVar117._16_4_ ^ 0xffffffff;
        auVar211._20_4_ = auVar117._20_4_ ^ 0xffffffff;
        auVar211._24_4_ = auVar117._24_4_ ^ 0xffffffff;
        auVar211._28_4_ = auVar117._28_4_ ^ 0xffffffff;
        auVar117 = vorps_avx(auVar120,auVar211);
        auVar117 = vandps_avx(auVar239,auVar117);
      }
    }
    auVar261 = ZEXT3264(local_b00);
    auVar9 = local_220 & auVar117;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0x7f,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar9 >> 0xbf,0) != '\0') ||
        (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0') {
      local_260 = ZEXT1632(auVar188);
      fVar213 = *(float *)(ray + k * 4 + 0x80) - (float)local_8a0._0_4_;
      auVar238._4_4_ = fVar213;
      auVar238._0_4_ = fVar213;
      auVar238._8_4_ = fVar213;
      auVar238._12_4_ = fVar213;
      auVar238._16_4_ = fVar213;
      auVar238._20_4_ = fVar213;
      auVar238._24_4_ = fVar213;
      auVar238._28_4_ = fVar213;
      auVar120 = vminps_avx(auVar238,auVar197);
      auVar33._4_4_ = fVar279 * local_a00._4_4_;
      auVar33._0_4_ = fVar264 * (float)local_a00._0_4_;
      auVar33._8_4_ = fVar276 * local_a00._8_4_;
      auVar33._12_4_ = fVar277 * local_a00._12_4_;
      auVar33._16_4_ = fVar278 * local_a00._16_4_;
      auVar33._20_4_ = fVar284 * local_a00._20_4_;
      auVar33._24_4_ = fVar285 * local_a00._24_4_;
      auVar33._28_4_ = fVar213;
      auVar188 = vfmadd213ps_fma(auVar124,local_720,auVar33);
      auVar112 = vfmadd213ps_fma(auVar7,auVar267,ZEXT1632(auVar188));
      auVar34._4_4_ = local_a00._4_4_ * (float)local_820._4_4_;
      auVar34._0_4_ = (float)local_a00._0_4_ * (float)local_820._0_4_;
      auVar34._8_4_ = local_a00._8_4_ * fStack_818;
      auVar34._12_4_ = local_a00._12_4_ * fStack_814;
      auVar34._16_4_ = local_a00._16_4_ * fStack_810;
      auVar34._20_4_ = local_a00._20_4_ * fStack_80c;
      auVar34._24_4_ = local_a00._24_4_ * fStack_808;
      auVar34._28_4_ = fVar213;
      auVar188 = vfmadd231ps_fma(auVar34,local_720,_local_800);
      auVar286 = vfmadd231ps_fma(ZEXT1632(auVar188),_local_7c0,auVar267);
      auVar65._4_4_ = uStack_83c;
      auVar65._0_4_ = local_840;
      auVar65._8_4_ = uStack_838;
      auVar65._12_4_ = uStack_834;
      auVar65._16_4_ = uStack_830;
      auVar65._20_4_ = uStack_82c;
      auVar65._24_4_ = uStack_828;
      auVar65._28_4_ = uStack_824;
      auVar124 = vandps_avx(ZEXT1632(auVar286),auVar65);
      auVar150._8_4_ = 0x219392ef;
      auVar150._0_8_ = 0x219392ef219392ef;
      auVar150._12_4_ = 0x219392ef;
      auVar150._16_4_ = 0x219392ef;
      auVar150._20_4_ = 0x219392ef;
      auVar150._24_4_ = 0x219392ef;
      auVar150._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar124,auVar150,1);
      auVar124 = vrcpps_avx(ZEXT1632(auVar286));
      auVar310._8_4_ = 0x3f800000;
      auVar310._0_8_ = &DAT_3f8000003f800000;
      auVar310._12_4_ = 0x3f800000;
      auVar310._16_4_ = 0x3f800000;
      auVar310._20_4_ = 0x3f800000;
      auVar310._24_4_ = 0x3f800000;
      auVar310._28_4_ = 0x3f800000;
      auVar239 = ZEXT1632(auVar286);
      auVar188 = vfnmadd213ps_fma(auVar124,auVar239,auVar310);
      auVar188 = vfmadd132ps_fma(ZEXT1632(auVar188),auVar124,auVar124);
      auVar281._0_4_ = auVar286._0_4_ ^ local_5e0;
      auVar281._4_4_ = auVar286._4_4_ ^ uStack_5dc;
      auVar281._8_4_ = auVar286._8_4_ ^ uStack_5d8;
      auVar281._12_4_ = auVar286._12_4_ ^ uStack_5d4;
      auVar281._16_4_ = fStack_5d0;
      auVar281._20_4_ = fStack_5cc;
      auVar281._24_4_ = fStack_5c8;
      auVar281._28_4_ = uStack_5c4;
      auVar290._0_4_ = auVar188._0_4_ * (float)(auVar112._0_4_ ^ local_5e0);
      auVar290._4_4_ = auVar188._4_4_ * (float)(auVar112._4_4_ ^ uStack_5dc);
      auVar290._8_4_ = auVar188._8_4_ * (float)(auVar112._8_4_ ^ uStack_5d8);
      auVar290._12_4_ = auVar188._12_4_ * (float)(auVar112._12_4_ ^ uStack_5d4);
      auVar290._16_4_ = fStack_5d0 * 0.0;
      auVar290._20_4_ = fStack_5cc * 0.0;
      auVar290._24_4_ = fStack_5c8 * 0.0;
      auVar290._28_4_ = 0;
      auVar124 = vcmpps_avx(auVar239,auVar281,1);
      auVar124 = vorps_avx(auVar9,auVar124);
      auVar298._8_4_ = 0xff800000;
      auVar298._0_8_ = 0xff800000ff800000;
      auVar298._12_4_ = 0xff800000;
      auVar298._16_4_ = 0xff800000;
      auVar298._20_4_ = 0xff800000;
      auVar298._24_4_ = 0xff800000;
      auVar298._28_4_ = 0xff800000;
      auVar124 = vblendvps_avx(auVar290,auVar298,auVar124);
      auVar89._4_4_ = fStack_23c;
      auVar89._0_4_ = local_240;
      auVar89._8_4_ = fStack_238;
      auVar89._12_4_ = fStack_234;
      auVar89._16_4_ = fStack_230;
      auVar89._20_4_ = fStack_22c;
      auVar89._24_4_ = fStack_228;
      auVar89._28_4_ = fStack_224;
      auVar7 = vmaxps_avx(auVar89,local_ae0);
      auVar7 = vmaxps_avx(auVar7,auVar124);
      auVar124 = vcmpps_avx(auVar239,auVar281,6);
      auVar124 = vorps_avx(auVar9,auVar124);
      auVar255._8_4_ = 0x7f800000;
      auVar255._0_8_ = 0x7f8000007f800000;
      auVar255._12_4_ = 0x7f800000;
      auVar255._16_4_ = 0x7f800000;
      auVar255._20_4_ = 0x7f800000;
      auVar255._24_4_ = 0x7f800000;
      auVar255._28_4_ = 0x7f800000;
      auVar124 = vblendvps_avx(auVar290,auVar255,auVar124);
      local_aa0 = vminps_avx(auVar120,auVar124);
      auVar124 = vsubps_avx(ZEXT832(0) << 0x20,_local_960);
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_980);
      auVar35._4_4_ = auVar9._4_4_ * fVar246;
      auVar35._0_4_ = auVar9._0_4_ * fVar244;
      auVar35._8_4_ = auVar9._8_4_ * fVar248;
      auVar35._12_4_ = auVar9._12_4_ * fVar225;
      auVar35._16_4_ = auVar9._16_4_ * fVar228;
      auVar35._20_4_ = auVar9._20_4_ * fVar230;
      auVar35._24_4_ = auVar9._24_4_ * fVar295;
      auVar35._28_4_ = auVar9._28_4_;
      auVar188 = vfnmsub231ps_fma(auVar35,local_9c0,auVar124);
      auVar124 = vsubps_avx(ZEXT832(0) << 0x20,auVar240);
      auVar112 = vfnmadd231ps_fma(ZEXT1632(auVar188),local_ac0,auVar124);
      auVar36._4_4_ = fVar246 * (float)local_820._4_4_;
      auVar36._0_4_ = fVar244 * (float)local_820._0_4_;
      auVar36._8_4_ = fVar248 * fStack_818;
      auVar36._12_4_ = fVar225 * fStack_814;
      auVar36._16_4_ = fVar228 * fStack_810;
      auVar36._20_4_ = fVar230 * fStack_80c;
      auVar36._24_4_ = fVar295 * fStack_808;
      auVar36._28_4_ = auVar124._28_4_;
      auVar188 = vfnmsub231ps_fma(auVar36,local_9c0,_local_800);
      auVar286 = vfnmadd231ps_fma(ZEXT1632(auVar188),_local_7c0,local_ac0);
      auVar242 = ZEXT1664(auVar286);
      auVar124 = vandps_avx(ZEXT1632(auVar286),auVar65);
      auVar120 = vrcpps_avx(ZEXT1632(auVar286));
      auVar172._8_4_ = 0x219392ef;
      auVar172._0_8_ = 0x219392ef219392ef;
      auVar172._12_4_ = 0x219392ef;
      auVar172._16_4_ = 0x219392ef;
      auVar172._20_4_ = 0x219392ef;
      auVar172._24_4_ = 0x219392ef;
      auVar172._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar124,auVar172,1);
      auVar282 = ZEXT3264(auVar9);
      auVar240 = ZEXT1632(auVar286);
      auVar188 = vfnmadd213ps_fma(auVar120,auVar240,auVar310);
      auVar188 = vfmadd132ps_fma(ZEXT1632(auVar188),auVar120,auVar120);
      auVar291._0_4_ = auVar286._0_4_ ^ local_5e0;
      auVar291._4_4_ = auVar286._4_4_ ^ uStack_5dc;
      auVar291._8_4_ = auVar286._8_4_ ^ uStack_5d8;
      auVar291._12_4_ = auVar286._12_4_ ^ uStack_5d4;
      auVar291._16_4_ = fStack_5d0;
      auVar291._20_4_ = fStack_5cc;
      auVar291._24_4_ = fStack_5c8;
      auVar291._28_4_ = uStack_5c4;
      auVar294 = ZEXT3264(auVar291);
      auVar37._4_4_ = auVar188._4_4_ * (float)(auVar112._4_4_ ^ uStack_5dc);
      auVar37._0_4_ = auVar188._0_4_ * (float)(auVar112._0_4_ ^ local_5e0);
      auVar37._8_4_ = auVar188._8_4_ * (float)(auVar112._8_4_ ^ uStack_5d8);
      auVar37._12_4_ = auVar188._12_4_ * (float)(auVar112._12_4_ ^ uStack_5d4);
      auVar37._16_4_ = fStack_5d0 * 0.0;
      auVar37._20_4_ = fStack_5cc * 0.0;
      auVar37._24_4_ = fStack_5c8 * 0.0;
      auVar37._28_4_ = uStack_5c4;
      auVar261 = ZEXT3264(auVar37);
      auVar124 = vcmpps_avx(auVar240,auVar291,1);
      auVar124 = vorps_avx(auVar9,auVar124);
      auVar151._8_4_ = 0xff800000;
      auVar151._0_8_ = 0xff800000ff800000;
      auVar151._12_4_ = 0xff800000;
      auVar151._16_4_ = 0xff800000;
      auVar151._20_4_ = 0xff800000;
      auVar151._24_4_ = 0xff800000;
      auVar151._28_4_ = 0xff800000;
      auVar124 = vblendvps_avx(auVar37,auVar151,auVar124);
      auVar300 = ZEXT3264(auVar124);
      _local_900 = vmaxps_avx(auVar7,auVar124);
      auVar124 = vcmpps_avx(auVar240,auVar291,6);
      auVar124 = vorps_avx(auVar9,auVar124);
      auVar198._8_4_ = 0x7f800000;
      auVar198._0_8_ = 0x7f8000007f800000;
      auVar198._12_4_ = 0x7f800000;
      auVar198._16_4_ = 0x7f800000;
      auVar198._20_4_ = 0x7f800000;
      auVar198._24_4_ = 0x7f800000;
      auVar198._28_4_ = 0x7f800000;
      auVar124 = vblendvps_avx(auVar37,auVar198,auVar124);
      auVar117 = vandps_avx(auVar117,local_220);
      local_280 = vminps_avx(local_aa0,auVar124);
      auVar124 = vcmpps_avx(_local_900,local_280,2);
      auVar9 = auVar117 & auVar124;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      {
        auVar294 = ZEXT3264(auVar310);
        auVar9 = vminps_avx(local_4e0,auVar310);
        auVar51 = ZEXT812(0);
        auVar201 = ZEXT1264(auVar51) << 0x20;
        auVar9 = vmaxps_avx(auVar9,ZEXT1232(auVar51) << 0x20);
        auVar7 = vminps_avx(local_500,auVar310);
        auVar7 = vmaxps_avx(auVar7,ZEXT1232(auVar51) << 0x20);
        auVar38._4_4_ = (auVar9._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar9._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar9._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar9._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar9._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar9._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar9._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar9._28_4_ + 7.0;
        auVar188 = vfmadd213ps_fma(auVar38,local_740,local_8e0);
        auVar39._4_4_ = (auVar7._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar7._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar7._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar7._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar7._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar7._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar7._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar7._28_4_ + 7.0;
        auVar112 = vfmadd213ps_fma(auVar39,local_740,local_8e0);
        auVar9 = vminps_avx(local_760,auVar254);
        auVar7 = vminps_avx(local_600,auVar11);
        auVar9 = vminps_avx(auVar9,auVar7);
        auVar9 = vsubps_avx(auVar9,_local_620);
        auVar117 = vandps_avx(auVar124,auVar117);
        local_4e0 = ZEXT1632(auVar188);
        local_500 = ZEXT1632(auVar112);
        auVar40._4_4_ = auVar9._4_4_ * 0.99999976;
        auVar40._0_4_ = auVar9._0_4_ * 0.99999976;
        auVar40._8_4_ = auVar9._8_4_ * 0.99999976;
        auVar40._12_4_ = auVar9._12_4_ * 0.99999976;
        auVar40._16_4_ = auVar9._16_4_ * 0.99999976;
        auVar40._20_4_ = auVar9._20_4_ * 0.99999976;
        auVar40._24_4_ = auVar9._24_4_ * 0.99999976;
        auVar40._28_4_ = auVar9._28_4_;
        auVar124 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
        auVar41._4_4_ = auVar124._4_4_ * auVar124._4_4_;
        auVar41._0_4_ = auVar124._0_4_ * auVar124._0_4_;
        auVar41._8_4_ = auVar124._8_4_ * auVar124._8_4_;
        auVar41._12_4_ = auVar124._12_4_ * auVar124._12_4_;
        auVar41._16_4_ = auVar124._16_4_ * auVar124._16_4_;
        auVar41._20_4_ = auVar124._20_4_ * auVar124._20_4_;
        auVar41._24_4_ = auVar124._24_4_ * auVar124._24_4_;
        auVar41._28_4_ = auVar124._28_4_;
        auVar9 = vsubps_avx(auVar271,auVar41);
        auVar42._4_4_ = auVar9._4_4_ * (float)local_520._4_4_;
        auVar42._0_4_ = auVar9._0_4_ * (float)local_520._0_4_;
        auVar42._8_4_ = auVar9._8_4_ * fStack_518;
        auVar42._12_4_ = auVar9._12_4_ * fStack_514;
        auVar42._16_4_ = auVar9._16_4_ * fStack_510;
        auVar42._20_4_ = auVar9._20_4_ * fStack_50c;
        auVar42._24_4_ = auVar9._24_4_ * fStack_508;
        auVar42._28_4_ = auVar124._28_4_;
        auVar7 = vsubps_avx(auVar28,auVar42);
        auVar282 = ZEXT3264(auVar7);
        auVar124 = vcmpps_avx(auVar7,ZEXT1232(auVar51) << 0x20,5);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar124[0x1f]) {
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          local_880 = ZEXT832(0) << 0x20;
          _local_620 = ZEXT832(0) << 0x20;
          auVar271 = ZEXT832(0) << 0x20;
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          local_860 = local_880;
        }
        else {
          auVar271 = vsqrtps_avx(auVar7);
          auVar257._0_4_ = fVar245 + fVar245;
          auVar257._4_4_ = fVar247 + fVar247;
          auVar257._8_4_ = fVar216 + fVar216;
          auVar257._12_4_ = fVar227 + fVar227;
          auVar257._16_4_ = fVar229 + fVar229;
          auVar257._20_4_ = fVar215 + fVar215;
          auVar257._24_4_ = fVar212 + fVar212;
          auVar257._28_4_ = fVar233 + fVar233;
          auVar120 = vrcpps_avx(auVar257);
          auVar188 = vfnmadd213ps_fma(auVar257,auVar120,auVar310);
          auVar188 = vfmadd132ps_fma(ZEXT1632(auVar188),auVar120,auVar120);
          auVar292._0_4_ = local_b00._0_4_ ^ local_5e0;
          auVar292._4_4_ = (uint)local_b00._4_4_ ^ uStack_5dc;
          auVar292._8_4_ = (uint)local_b00._8_4_ ^ uStack_5d8;
          auVar292._12_4_ = (uint)local_b00._12_4_ ^ uStack_5d4;
          auVar292._16_4_ = (uint)local_b00._16_4_ ^ (uint)fStack_5d0;
          auVar292._20_4_ = (uint)local_b00._20_4_ ^ (uint)fStack_5cc;
          auVar292._24_4_ = (uint)local_b00._24_4_ ^ (uint)fStack_5c8;
          auVar292._28_4_ = (uint)local_b00._28_4_ ^ uStack_5c4;
          auVar120 = vsubps_avx(auVar292,auVar271);
          auVar240 = vsubps_avx(auVar271,local_b00);
          fVar233 = auVar120._0_4_ * auVar188._0_4_;
          fVar244 = auVar120._4_4_ * auVar188._4_4_;
          auVar43._4_4_ = fVar244;
          auVar43._0_4_ = fVar233;
          fVar245 = auVar120._8_4_ * auVar188._8_4_;
          auVar43._8_4_ = fVar245;
          fVar246 = auVar120._12_4_ * auVar188._12_4_;
          auVar43._12_4_ = fVar246;
          fVar247 = auVar120._16_4_ * 0.0;
          auVar43._16_4_ = fVar247;
          fVar248 = auVar120._20_4_ * 0.0;
          auVar43._20_4_ = fVar248;
          fVar216 = auVar120._24_4_ * 0.0;
          auVar43._24_4_ = fVar216;
          auVar43._28_4_ = auVar271._28_4_;
          fVar225 = auVar240._0_4_ * auVar188._0_4_;
          fVar227 = auVar240._4_4_ * auVar188._4_4_;
          auVar44._4_4_ = fVar227;
          auVar44._0_4_ = fVar225;
          fVar228 = auVar240._8_4_ * auVar188._8_4_;
          auVar44._8_4_ = fVar228;
          fVar229 = auVar240._12_4_ * auVar188._12_4_;
          auVar44._12_4_ = fVar229;
          fVar230 = auVar240._16_4_ * 0.0;
          auVar44._16_4_ = fVar230;
          fVar215 = auVar240._20_4_ * 0.0;
          auVar44._20_4_ = fVar215;
          fVar295 = auVar240._24_4_ * 0.0;
          auVar44._24_4_ = fVar295;
          auVar44._28_4_ = auVar120._28_4_;
          auVar294 = ZEXT3264(auVar44);
          auVar188 = vfmadd213ps_fma(auVar275,auVar43,auVar270);
          auVar112 = vfmadd213ps_fma(auVar275,auVar44,auVar270);
          auVar120 = ZEXT1632(CONCAT412(auVar188._12_4_ * fVar226,
                                        CONCAT48(auVar188._8_4_ * fVar202,
                                                 CONCAT44(auVar188._4_4_ * fVar214,
                                                          auVar188._0_4_ * fVar102))));
          auVar271 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar226,
                                        CONCAT48(auVar112._8_4_ * fVar202,
                                                 CONCAT44(auVar112._4_4_ * fVar214,
                                                          auVar112._0_4_ * fVar102))));
          auVar188 = vfmadd213ps_fma(local_560,auVar120,auVar146);
          auVar112 = vfmadd213ps_fma(local_560,auVar271,auVar146);
          auVar286 = vfmadd213ps_fma(local_580,auVar120,auVar223);
          auVar6 = vfmadd213ps_fma(local_580,auVar271,auVar223);
          auVar235 = vfmadd213ps_fma(auVar120,auVar10,local_540);
          auVar141 = vfmadd213ps_fma(auVar10,auVar271,local_540);
          auVar45._4_4_ = (float)local_7c0._4_4_ * fVar244;
          auVar45._0_4_ = (float)local_7c0._0_4_ * fVar233;
          auVar45._8_4_ = fStack_7b8 * fVar245;
          auVar45._12_4_ = fStack_7b4 * fVar246;
          auVar45._16_4_ = fStack_7b0 * fVar247;
          auVar45._20_4_ = fStack_7ac * fVar248;
          auVar45._24_4_ = fStack_7a8 * fVar216;
          auVar45._28_4_ = 0;
          auVar120 = vsubps_avx(auVar45,ZEXT1632(auVar188));
          auVar152._0_4_ = (float)local_800._0_4_ * fVar233;
          auVar152._4_4_ = (float)local_800._4_4_ * fVar244;
          auVar152._8_4_ = fStack_7f8 * fVar245;
          auVar152._12_4_ = fStack_7f4 * fVar246;
          auVar152._16_4_ = fStack_7f0 * fVar247;
          auVar152._20_4_ = fStack_7ec * fVar248;
          auVar152._24_4_ = fStack_7e8 * fVar216;
          auVar152._28_4_ = 0;
          auVar271 = vsubps_avx(auVar152,ZEXT1632(auVar286));
          auVar173._0_4_ = (float)local_820._0_4_ * fVar233;
          auVar173._4_4_ = (float)local_820._4_4_ * fVar244;
          auVar173._8_4_ = fStack_818 * fVar245;
          auVar173._12_4_ = fStack_814 * fVar246;
          auVar173._16_4_ = fStack_810 * fVar247;
          auVar173._20_4_ = fStack_80c * fVar248;
          auVar173._24_4_ = fStack_808 * fVar216;
          auVar173._28_4_ = 0;
          auVar10 = vsubps_avx(auVar173,ZEXT1632(auVar235));
          auVar201 = ZEXT3264(auVar10);
          auVar258._0_4_ = (float)local_7c0._0_4_ * fVar225;
          auVar258._4_4_ = (float)local_7c0._4_4_ * fVar227;
          auVar258._8_4_ = fStack_7b8 * fVar228;
          auVar258._12_4_ = fStack_7b4 * fVar229;
          auVar258._16_4_ = fStack_7b0 * fVar230;
          auVar258._20_4_ = fStack_7ac * fVar215;
          auVar258._24_4_ = fStack_7a8 * fVar295;
          auVar258._28_4_ = 0;
          local_860 = vsubps_avx(auVar258,ZEXT1632(auVar112));
          auVar46._4_4_ = (float)local_800._4_4_ * fVar227;
          auVar46._0_4_ = (float)local_800._0_4_ * fVar225;
          auVar46._8_4_ = fStack_7f8 * fVar228;
          auVar46._12_4_ = fStack_7f4 * fVar229;
          auVar46._16_4_ = fStack_7f0 * fVar230;
          auVar46._20_4_ = fStack_7ec * fVar215;
          auVar46._24_4_ = fStack_7e8 * fVar295;
          auVar46._28_4_ = local_860._28_4_;
          local_880 = vsubps_avx(auVar46,ZEXT1632(auVar6));
          auVar47._4_4_ = (float)local_820._4_4_ * fVar227;
          auVar47._0_4_ = (float)local_820._0_4_ * fVar225;
          auVar47._8_4_ = fStack_818 * fVar228;
          auVar47._12_4_ = fStack_814 * fVar229;
          auVar47._16_4_ = fStack_810 * fVar230;
          auVar47._20_4_ = fStack_80c * fVar215;
          auVar47._24_4_ = fStack_808 * fVar295;
          auVar47._28_4_ = local_880._28_4_;
          _local_620 = vsubps_avx(auVar47,ZEXT1632(auVar141));
          auVar300 = ZEXT864(0) << 0x20;
          auVar10 = vcmpps_avx(auVar7,_DAT_02020f00,5);
          auVar259._8_4_ = 0x7f800000;
          auVar259._0_8_ = 0x7f8000007f800000;
          auVar259._12_4_ = 0x7f800000;
          auVar259._16_4_ = 0x7f800000;
          auVar259._20_4_ = 0x7f800000;
          auVar259._24_4_ = 0x7f800000;
          auVar259._28_4_ = 0x7f800000;
          auVar241 = vblendvps_avx(auVar259,auVar43,auVar10);
          auVar66._4_4_ = uStack_83c;
          auVar66._0_4_ = local_840;
          auVar66._8_4_ = uStack_838;
          auVar66._12_4_ = uStack_834;
          auVar66._16_4_ = uStack_830;
          auVar66._20_4_ = uStack_82c;
          auVar66._24_4_ = uStack_828;
          auVar66._28_4_ = uStack_824;
          auVar7 = vandps_avx(auVar66,auVar309);
          auVar7 = vmaxps_avx(local_4a0,auVar7);
          auVar282 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar48._4_4_ = auVar7._4_4_ * 1.9073486e-06;
          auVar48._0_4_ = auVar7._0_4_ * 1.9073486e-06;
          auVar48._8_4_ = auVar7._8_4_ * 1.9073486e-06;
          auVar48._12_4_ = auVar7._12_4_ * 1.9073486e-06;
          auVar48._16_4_ = auVar7._16_4_ * 1.9073486e-06;
          auVar48._20_4_ = auVar7._20_4_ * 1.9073486e-06;
          auVar48._24_4_ = auVar7._24_4_ * 1.9073486e-06;
          auVar48._28_4_ = auVar7._28_4_;
          auVar7 = vandps_avx(auVar66,local_640);
          auVar7 = vcmpps_avx(auVar7,auVar48,1);
          auVar260._8_4_ = 0xff800000;
          auVar260._0_8_ = 0xff800000ff800000;
          auVar260._12_4_ = 0xff800000;
          auVar260._16_4_ = 0xff800000;
          auVar260._20_4_ = 0xff800000;
          auVar260._24_4_ = 0xff800000;
          auVar260._28_4_ = 0xff800000;
          auVar256 = vblendvps_avx(auVar260,auVar44,auVar10);
          auVar240 = auVar10 & auVar7;
          if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar240 >> 0x7f,0) != '\0') ||
                (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar240 >> 0xbf,0) != '\0') ||
              (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar240[0x1f] < '\0') {
            auVar124 = vandps_avx(auVar7,auVar10);
            auVar7 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,2);
            auVar293._8_4_ = 0xff800000;
            auVar293._0_8_ = 0xff800000ff800000;
            auVar293._12_4_ = 0xff800000;
            auVar293._16_4_ = 0xff800000;
            auVar293._20_4_ = 0xff800000;
            auVar293._24_4_ = 0xff800000;
            auVar293._28_4_ = 0xff800000;
            auVar294 = ZEXT3264(auVar293);
            auVar299._8_4_ = 0x7f800000;
            auVar299._0_8_ = 0x7f8000007f800000;
            auVar299._12_4_ = 0x7f800000;
            auVar299._16_4_ = 0x7f800000;
            auVar299._20_4_ = 0x7f800000;
            auVar299._24_4_ = 0x7f800000;
            auVar299._28_4_ = 0x7f800000;
            auVar300 = ZEXT3264(auVar299);
            auVar9 = vblendvps_avx(auVar299,auVar293,auVar7);
            auVar188 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
            auVar240 = vpmovsxwd_avx2(auVar188);
            auVar241 = vblendvps_avx(auVar241,auVar9,auVar240);
            auVar9 = vblendvps_avx(auVar293,auVar299,auVar7);
            auVar282 = ZEXT3264(auVar9);
            auVar256 = vblendvps_avx(auVar256,auVar9,auVar240);
            auVar224._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
            auVar224._8_4_ = auVar124._8_4_ ^ 0xffffffff;
            auVar224._12_4_ = auVar124._12_4_ ^ 0xffffffff;
            auVar224._16_4_ = auVar124._16_4_ ^ 0xffffffff;
            auVar224._20_4_ = auVar124._20_4_ ^ 0xffffffff;
            auVar224._24_4_ = auVar124._24_4_ ^ 0xffffffff;
            auVar224._28_4_ = auVar124._28_4_ ^ 0xffffffff;
            auVar124 = vorps_avx(auVar7,auVar224);
            auVar124 = vandps_avx(auVar10,auVar124);
          }
        }
        local_2e0 = _local_900;
        local_2c0 = vminps_avx(local_280,auVar241);
        _local_2a0 = vmaxps_avx(_local_900,auVar256);
        auVar261 = ZEXT3264(_local_2a0);
        auVar9 = vcmpps_avx(_local_900,local_2c0,2);
        _local_520 = vandps_avx(auVar9,auVar117);
        local_5a0 = _local_520;
        auVar9 = vcmpps_avx(_local_2a0,local_280,2);
        local_5c0 = vandps_avx(auVar9,auVar117);
        auVar242 = ZEXT3264(local_5c0);
        auVar117 = vorps_avx(local_5c0,_local_520);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0x7f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0xbf,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar117[0x1f] < '\0') {
          local_540 = local_5c0;
          local_560._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
          local_560._8_4_ = auVar124._8_4_ ^ 0xffffffff;
          local_560._12_4_ = auVar124._12_4_ ^ 0xffffffff;
          local_560._16_4_ = auVar124._16_4_ ^ 0xffffffff;
          local_560._20_4_ = auVar124._20_4_ ^ 0xffffffff;
          local_560._24_4_ = auVar124._24_4_ ^ 0xffffffff;
          local_560._28_4_ = auVar124._28_4_ ^ 0xffffffff;
          auVar178._0_4_ = auVar201._0_4_ * (float)local_820._0_4_;
          auVar178._4_4_ = auVar201._4_4_ * (float)local_820._4_4_;
          auVar178._8_4_ = auVar201._8_4_ * fStack_818;
          auVar178._12_4_ = auVar201._12_4_ * fStack_814;
          auVar178._16_4_ = auVar201._16_4_ * fStack_810;
          auVar178._20_4_ = auVar201._20_4_ * fStack_80c;
          auVar178._28_36_ = auVar201._28_36_;
          auVar178._24_4_ = auVar201._24_4_ * fStack_808;
          auVar188 = vfmadd132ps_fma(auVar271,auVar178._0_32_,_local_800);
          auVar188 = vfmadd132ps_fma(auVar120,ZEXT1632(auVar188),_local_7c0);
          auVar67._4_4_ = uStack_83c;
          auVar67._0_4_ = local_840;
          auVar67._8_4_ = uStack_838;
          auVar67._12_4_ = uStack_834;
          auVar67._16_4_ = uStack_830;
          auVar67._20_4_ = uStack_82c;
          auVar67._24_4_ = uStack_828;
          auVar67._28_4_ = uStack_824;
          auVar117 = vandps_avx(ZEXT1632(auVar188),auVar67);
          auVar153._8_4_ = 0x3e99999a;
          auVar153._0_8_ = 0x3e99999a3e99999a;
          auVar153._12_4_ = 0x3e99999a;
          auVar153._16_4_ = 0x3e99999a;
          auVar153._20_4_ = 0x3e99999a;
          auVar153._24_4_ = 0x3e99999a;
          auVar153._28_4_ = 0x3e99999a;
          auVar117 = vcmpps_avx(auVar117,auVar153,1);
          auVar117 = vorps_avx(auVar117,local_560);
          auVar154._8_4_ = 3;
          auVar154._0_8_ = 0x300000003;
          auVar154._12_4_ = 3;
          auVar154._16_4_ = 3;
          auVar154._20_4_ = 3;
          auVar154._24_4_ = 3;
          auVar154._28_4_ = 3;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar174,auVar154,auVar117);
          uVar97 = (undefined4)uVar98;
          local_580._4_4_ = uVar97;
          local_580._0_4_ = uVar97;
          local_580._8_4_ = uVar97;
          local_580._12_4_ = uVar97;
          local_580._16_4_ = uVar97;
          local_580._20_4_ = uVar97;
          local_580._24_4_ = uVar97;
          local_580._28_4_ = uVar97;
          local_640 = vpcmpgtd_avx2(auVar117,local_580);
          local_5a0 = vpandn_avx2(local_640,_local_520);
          auVar117 = _local_520 & ~local_640;
          local_600._0_8_ = uVar98;
          auVar188 = (undefined1  [16])0x0;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar112 = vminps_avx(local_a40,local_a60);
            auVar188 = vmaxps_avx(local_a40,local_a60);
            auVar286 = vminps_avx(local_a50,_local_a70);
            auVar6 = vminps_avx(auVar112,auVar286);
            auVar112 = vmaxps_avx(local_a50,_local_a70);
            auVar286 = vmaxps_avx(auVar188,auVar112);
            auVar188 = vandps_avx(auVar6,local_920);
            auVar112 = vandps_avx(auVar286,local_920);
            auVar188 = vmaxps_avx(auVar188,auVar112);
            auVar112 = vmovshdup_avx(auVar188);
            auVar112 = vmaxss_avx(auVar112,auVar188);
            auVar188 = vshufpd_avx(auVar188,auVar188,1);
            auVar188 = vmaxss_avx(auVar188,auVar112);
            local_980._0_4_ = auVar188._0_4_ * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar286,auVar286,0xff);
            local_7a0._16_16_ = auVar254._16_16_;
            local_7e0._4_4_ = (float)local_900._4_4_ + (float)local_780._4_4_;
            local_7e0._0_4_ = (float)local_900._0_4_ + (float)local_780._0_4_;
            fStack_7d8 = fStack_8f8 + fStack_778;
            fStack_7d4 = fStack_8f4 + fStack_774;
            fStack_7d0 = fStack_8f0 + fStack_770;
            fStack_7cc = fStack_8ec + fStack_76c;
            fStack_7c8 = fStack_8e8 + fStack_768;
            fStack_7c4 = fStack_8e4 + fStack_764;
            local_ae0 = _local_2a0;
            do {
              auVar155._8_4_ = 0x7f800000;
              auVar155._0_8_ = 0x7f8000007f800000;
              auVar155._12_4_ = 0x7f800000;
              auVar155._16_4_ = 0x7f800000;
              auVar155._20_4_ = 0x7f800000;
              auVar155._24_4_ = 0x7f800000;
              auVar155._28_4_ = 0x7f800000;
              auVar117 = vblendvps_avx(auVar155,_local_900,local_5a0);
              auVar124 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar124 = vminps_avx(auVar117,auVar124);
              auVar9 = vshufpd_avx(auVar124,auVar124,5);
              auVar124 = vminps_avx(auVar124,auVar9);
              auVar9 = vpermpd_avx2(auVar124,0x4e);
              auVar124 = vminps_avx(auVar124,auVar9);
              auVar124 = vcmpps_avx(auVar117,auVar124,0);
              auVar9 = local_5a0 & auVar124;
              auVar117 = local_5a0;
              if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar9[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar124,local_5a0);
              }
              uVar93 = vmovmskps_avx(auVar117);
              iVar12 = 0;
              for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar94 = iVar12 << 2;
              *(undefined4 *)(local_5a0 + uVar94) = 0;
              uVar93 = *(uint *)(local_4e0 + uVar94);
              uVar94 = *(uint *)(local_2e0 + uVar94);
              fVar233 = local_b04;
              if ((float)local_930._0_4_ < 0.0) {
                fVar233 = sqrtf((float)local_930._0_4_);
              }
              auVar282 = ZEXT464(uVar94);
              auVar201 = ZEXT464(uVar93);
              local_9c0._0_4_ = fVar233 * 1.9073486e-06;
              lVar99 = 4;
              do {
                fVar233 = auVar282._0_4_;
                auVar107._4_4_ = fVar233;
                auVar107._0_4_ = fVar233;
                auVar107._8_4_ = fVar233;
                auVar107._12_4_ = fVar233;
                auVar112 = vfmadd213ps_fma(auVar107,local_910,_DAT_01feba10);
                fVar247 = auVar201._0_4_;
                fVar214 = 1.0 - fVar247;
                local_aa0._0_16_ = ZEXT416((uint)fVar214);
                auVar141 = SUB6416(ZEXT464(0x40400000),0);
                auVar235 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar106 = auVar201._0_16_;
                auVar286 = vfmadd213ss_fma(auVar141,auVar106,auVar235);
                auVar188 = vfmadd213ss_fma(auVar286,ZEXT416((uint)(fVar247 * fVar247)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar6 = vfmadd213ss_fma(auVar141,ZEXT416((uint)fVar214),auVar235);
                auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)(fVar214 * fVar214)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar244 = fVar214 * fVar214 * -fVar247 * 0.5;
                fVar102 = auVar188._0_4_ * 0.5;
                fVar245 = auVar6._0_4_ * 0.5;
                fVar246 = fVar247 * fVar247 * -fVar214 * 0.5;
                auVar180._0_4_ = fVar246 * (float)local_a70._0_4_;
                auVar180._4_4_ = fVar246 * (float)local_a70._4_4_;
                auVar180._8_4_ = fVar246 * fStack_a68;
                auVar180._12_4_ = fVar246 * fStack_a64;
                auVar205._4_4_ = fVar245;
                auVar205._0_4_ = fVar245;
                auVar205._8_4_ = fVar245;
                auVar205._12_4_ = fVar245;
                auVar188 = vfmadd132ps_fma(auVar205,auVar180,local_a50);
                auVar164._4_4_ = fVar102;
                auVar164._0_4_ = fVar102;
                auVar164._8_4_ = fVar102;
                auVar164._12_4_ = fVar102;
                auVar188 = vfmadd132ps_fma(auVar164,auVar188,local_a60);
                auVar181._4_4_ = fVar244;
                auVar181._0_4_ = fVar244;
                auVar181._8_4_ = fVar244;
                auVar181._12_4_ = fVar244;
                auVar188 = vfmadd132ps_fma(auVar181,auVar188,local_a40);
                auVar235 = vfmadd231ss_fma(auVar235,auVar106,ZEXT416(0x41100000));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar106,ZEXT416(0x40800000)
                                        );
                local_a00._0_16_ = auVar6;
                local_720._0_16_ = auVar188;
                auVar188 = vsubps_avx(auVar112,auVar188);
                _local_960 = auVar188;
                auVar188 = vdpps_avx(auVar188,auVar188,0x7f);
                auVar112 = vfmadd213ss_fma(auVar141,auVar106,ZEXT416(0xbf800000));
                local_ac0._0_16_ = auVar112;
                fVar244 = auVar188._0_4_;
                if (fVar244 < 0.0) {
                  local_9a0._0_4_ = auVar286._0_4_;
                  local_b00._0_16_ = auVar235;
                  local_8e0._0_4_ = fVar214 * -2.0;
                  local_aa0._0_16_ = ZEXT416((uint)fVar214);
                  auVar300._0_4_ = sqrtf(fVar244);
                  auVar300._4_60_ = extraout_var;
                  auVar286 = ZEXT416((uint)local_9a0._0_4_);
                  auVar112 = auVar300._0_16_;
                  fVar102 = (float)local_8e0._0_4_;
                  auVar235 = local_b00._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar188,auVar188);
                  fVar102 = fVar214 * -2.0;
                }
                fVar245 = local_aa0._0_4_;
                auVar286 = vfmadd213ss_fma(auVar286,ZEXT416((uint)(fVar247 + fVar247)),
                                           ZEXT416((uint)(fVar247 * fVar247 * 3.0)));
                auVar133 = SUB6416(ZEXT464(0x40000000),0);
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,auVar133);
                auVar141 = vfmadd231ss_fma(ZEXT416((uint)(fVar245 * fVar245 * -3.0)),
                                           ZEXT416((uint)(fVar245 + fVar245)),auVar6);
                auVar105 = vfnmadd231ss_fma(ZEXT416((uint)(fVar247 * (fVar245 + fVar245))),
                                            local_aa0._0_16_,local_aa0._0_16_);
                auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar102),auVar106,
                                         ZEXT416((uint)(fVar247 * fVar247)));
                fVar102 = auVar105._0_4_ * 0.5;
                fVar245 = auVar286._0_4_ * 0.5;
                fVar246 = auVar141._0_4_ * 0.5;
                fVar214 = auVar6._0_4_ * 0.5;
                auVar182._0_4_ = (float)local_a70._0_4_ * fVar214;
                auVar182._4_4_ = (float)local_a70._4_4_ * fVar214;
                auVar182._8_4_ = fStack_a68 * fVar214;
                auVar182._12_4_ = fStack_a64 * fVar214;
                auVar165._4_4_ = fVar246;
                auVar165._0_4_ = fVar246;
                auVar165._8_4_ = fVar246;
                auVar165._12_4_ = fVar246;
                auVar286 = vfmadd213ps_fma(auVar165,local_a50,auVar182);
                auVar130._4_4_ = fVar245;
                auVar130._0_4_ = fVar245;
                auVar130._8_4_ = fVar245;
                auVar130._12_4_ = fVar245;
                auVar286 = vfmadd213ps_fma(auVar130,local_a60,auVar286);
                auVar287._4_4_ = fVar102;
                auVar287._0_4_ = fVar102;
                auVar287._8_4_ = fVar102;
                auVar287._12_4_ = fVar102;
                local_aa0._0_16_ = vfmadd213ps_fma(auVar287,local_a40,auVar286);
                auVar141 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar106,auVar133);
                auVar108._0_4_ = (float)local_a70._0_4_ * (float)local_ac0._0_4_;
                auVar108._4_4_ = (float)local_a70._4_4_ * (float)local_ac0._0_4_;
                auVar108._8_4_ = fStack_a68 * (float)local_ac0._0_4_;
                auVar108._12_4_ = fStack_a64 * (float)local_ac0._0_4_;
                auVar166._4_4_ = local_a00._0_4_;
                auVar166._0_4_ = local_a00._0_4_;
                auVar166._8_4_ = local_a00._0_4_;
                auVar166._12_4_ = local_a00._0_4_;
                auVar286 = vfmadd213ps_fma(auVar166,local_a50,auVar108);
                uVar97 = auVar235._0_4_;
                auVar183._4_4_ = uVar97;
                auVar183._0_4_ = uVar97;
                auVar183._8_4_ = uVar97;
                auVar183._12_4_ = uVar97;
                auVar286 = vfmadd213ps_fma(auVar183,local_a60,auVar286);
                auVar6 = vdpps_avx(local_aa0._0_16_,local_aa0._0_16_,0x7f);
                auVar131._0_4_ = auVar141._0_4_;
                auVar131._4_4_ = auVar131._0_4_;
                auVar131._8_4_ = auVar131._0_4_;
                auVar131._12_4_ = auVar131._0_4_;
                auVar141 = vfmadd213ps_fma(auVar131,local_a40,auVar286);
                auVar286 = vblendps_avx(auVar6,_DAT_01feba10,0xe);
                auVar235 = vrsqrtss_avx(auVar286,auVar286);
                fVar246 = auVar6._0_4_;
                fVar102 = auVar235._0_4_;
                auVar235 = vdpps_avx(local_aa0._0_16_,auVar141,0x7f);
                fVar102 = fVar102 * 1.5 + fVar246 * -0.5 * fVar102 * fVar102 * fVar102;
                auVar132._0_4_ = auVar141._0_4_ * fVar246;
                auVar132._4_4_ = auVar141._4_4_ * fVar246;
                auVar132._8_4_ = auVar141._8_4_ * fVar246;
                auVar132._12_4_ = auVar141._12_4_ * fVar246;
                fVar245 = auVar235._0_4_;
                auVar221._0_4_ = local_aa0._0_4_ * fVar245;
                auVar221._4_4_ = local_aa0._4_4_ * fVar245;
                fVar214 = local_aa0._8_4_;
                auVar221._8_4_ = fVar214 * fVar245;
                fVar248 = local_aa0._12_4_;
                auVar221._12_4_ = fVar248 * fVar245;
                auVar235 = vsubps_avx(auVar132,auVar221);
                auVar286 = vrcpss_avx(auVar286,auVar286);
                auVar141 = vfnmadd213ss_fma(auVar286,auVar6,auVar133);
                fVar245 = auVar286._0_4_ * auVar141._0_4_;
                auVar286 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(fVar233 * (float)local_9c0._0_4_)));
                local_9a0._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
                local_9a0._8_4_ = -fVar214;
                local_9a0._12_4_ = -fVar248;
                auVar184._0_4_ = fVar102 * auVar235._0_4_ * fVar245;
                auVar184._4_4_ = fVar102 * auVar235._4_4_ * fVar245;
                auVar184._8_4_ = fVar102 * auVar235._8_4_ * fVar245;
                auVar184._12_4_ = fVar102 * auVar235._12_4_ * fVar245;
                auVar236._0_4_ = local_aa0._0_4_ * fVar102;
                auVar236._4_4_ = local_aa0._4_4_ * fVar102;
                auVar236._8_4_ = fVar214 * fVar102;
                auVar236._12_4_ = fVar248 * fVar102;
                local_a00._0_4_ = auVar286._0_4_;
                if (fVar246 < -fVar246) {
                  local_ac0._0_4_ = auVar112._0_4_;
                  local_b00._0_16_ = auVar184;
                  fVar102 = sqrtf(fVar246);
                  auVar286 = ZEXT416((uint)local_a00._0_4_);
                  auVar112 = ZEXT416((uint)local_ac0._0_4_);
                  auVar184 = local_b00._0_16_;
                }
                else {
                  auVar6 = vsqrtss_avx(auVar6,auVar6);
                  fVar102 = auVar6._0_4_;
                }
                auVar6 = vdpps_avx(_local_960,auVar236,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)local_980._0_4_),auVar112,auVar286);
                auVar235 = vdpps_avx(local_9a0._0_16_,auVar236,0x7f);
                auVar141 = vdpps_avx(_local_960,auVar184,0x7f);
                local_ac0._0_16_ = vdpps_avx(local_910,auVar236,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_980._0_4_ / fVar102)),
                                           auVar106);
                auVar300 = ZEXT1664(auVar106);
                fVar102 = auVar235._0_4_ + auVar141._0_4_;
                auVar109._0_4_ = auVar6._0_4_ * auVar6._0_4_;
                auVar109._4_4_ = auVar6._4_4_ * auVar6._4_4_;
                auVar109._8_4_ = auVar6._8_4_ * auVar6._8_4_;
                auVar109._12_4_ = auVar6._12_4_ * auVar6._12_4_;
                auVar112 = vdpps_avx(_local_960,local_9a0._0_16_,0x7f);
                auVar141 = vsubps_avx(auVar188,auVar109);
                auVar235 = vrsqrtss_avx(auVar141,auVar141);
                fVar246 = auVar141._0_4_;
                fVar245 = auVar235._0_4_;
                fVar245 = fVar245 * 1.5 + fVar246 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar235 = vdpps_avx(_local_960,local_910,0x7f);
                local_9a0._0_16_ = vfnmadd231ss_fma(auVar112,auVar6,ZEXT416((uint)fVar102));
                auVar112 = vfnmadd231ss_fma(auVar235,auVar6,local_ac0._0_16_);
                if (fVar246 < 0.0) {
                  local_b00._0_4_ = auVar106._0_4_;
                  local_8e0._0_16_ = ZEXT416((uint)fVar102);
                  local_740._0_4_ = fVar245;
                  local_760._0_16_ = auVar112;
                  fVar246 = sqrtf(fVar246);
                  auVar300 = ZEXT464((uint)local_b00._0_4_);
                  auVar286 = ZEXT416((uint)local_a00._0_4_);
                  fVar245 = (float)local_740._0_4_;
                  auVar112 = local_760._0_16_;
                  auVar235 = local_8e0._0_16_;
                }
                else {
                  auVar235 = vsqrtss_avx(auVar141,auVar141);
                  fVar246 = auVar235._0_4_;
                  auVar235 = ZEXT416((uint)fVar102);
                }
                auVar294 = ZEXT1664(auVar6);
                auVar261 = ZEXT3264(local_ae0);
                auVar141 = vpermilps_avx(local_720._0_16_,0xff);
                auVar106 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
                auVar105 = vfmsub213ss_fma(local_9a0._0_16_,ZEXT416((uint)fVar245),auVar106);
                auVar242 = ZEXT1664(auVar105);
                auVar185._0_8_ = local_ac0._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = local_ac0._8_4_ ^ 0x80000000;
                auVar185._12_4_ = local_ac0._12_4_ ^ 0x80000000;
                auVar206._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar112 = ZEXT416((uint)(auVar112._0_4_ * fVar245));
                auVar133 = vfmsub231ss_fma(ZEXT416((uint)(local_ac0._0_4_ * auVar105._0_4_)),
                                           auVar235,auVar112);
                auVar112 = vinsertps_avx(auVar112,auVar185,0x10);
                uVar97 = auVar133._0_4_;
                auVar186._4_4_ = uVar97;
                auVar186._0_4_ = uVar97;
                auVar186._8_4_ = uVar97;
                auVar186._12_4_ = uVar97;
                auVar112 = vdivps_avx(auVar112,auVar186);
                auVar133 = ZEXT416((uint)(fVar246 - auVar141._0_4_));
                auVar141 = vinsertps_avx(auVar6,auVar133,0x10);
                auVar167._0_4_ = auVar141._0_4_ * auVar112._0_4_;
                auVar167._4_4_ = auVar141._4_4_ * auVar112._4_4_;
                auVar167._8_4_ = auVar141._8_4_ * auVar112._8_4_;
                auVar167._12_4_ = auVar141._12_4_ * auVar112._12_4_;
                auVar112 = vinsertps_avx(auVar206,auVar235,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar186);
                auVar187._0_4_ = auVar141._0_4_ * auVar112._0_4_;
                auVar187._4_4_ = auVar141._4_4_ * auVar112._4_4_;
                auVar187._8_4_ = auVar141._8_4_ * auVar112._8_4_;
                auVar187._12_4_ = auVar141._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar167,auVar167);
                auVar235 = vhaddps_avx(auVar187,auVar187);
                fVar247 = fVar247 - auVar112._0_4_;
                auVar201 = ZEXT464((uint)fVar247);
                fVar233 = fVar233 - auVar235._0_4_;
                auVar282 = ZEXT464((uint)fVar233);
                auVar112 = vandps_avx(auVar6,local_920);
                if (auVar300._0_4_ <= auVar112._0_4_) {
LAB_016b9000:
                  bVar50 = false;
                }
                else {
                  auVar286 = vfmadd231ss_fma(ZEXT416((uint)(auVar286._0_4_ + auVar300._0_4_)),
                                             local_7a0._0_16_,ZEXT416(0x36000000));
                  auVar112 = vandps_avx(auVar133,local_920);
                  if (auVar286._0_4_ <= auVar112._0_4_) goto LAB_016b9000;
                  fVar233 = fVar233 + (float)local_8a0._0_4_;
                  auVar282 = ZEXT464((uint)fVar233);
                  bVar50 = true;
                  if ((((fVar101 <= fVar233) &&
                       (fVar102 = *(float *)(ray + k * 4 + 0x80), fVar233 <= fVar102)) &&
                      (0.0 <= fVar247)) && (fVar247 <= 1.0)) {
                    auVar188 = vrsqrtss_avx(auVar188,auVar188);
                    fVar245 = auVar188._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar92].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar244 = fVar245 * 1.5 + fVar244 * -0.5 * fVar245 * fVar245 * fVar245;
                      auVar134._0_4_ = fVar244 * (float)local_960._0_4_;
                      auVar134._4_4_ = fVar244 * (float)local_960._4_4_;
                      auVar134._8_4_ = fVar244 * fStack_958;
                      auVar134._12_4_ = fVar244 * fStack_954;
                      auVar235 = vfmadd213ps_fma(auVar106,auVar134,local_aa0._0_16_);
                      auVar188 = vshufps_avx(auVar134,auVar134,0xc9);
                      auVar112 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                      auVar135._0_4_ = auVar134._0_4_ * auVar112._0_4_;
                      auVar135._4_4_ = auVar134._4_4_ * auVar112._4_4_;
                      auVar135._8_4_ = auVar134._8_4_ * auVar112._8_4_;
                      auVar135._12_4_ = auVar134._12_4_ * auVar112._12_4_;
                      auVar286 = vfmsub231ps_fma(auVar135,local_aa0._0_16_,auVar188);
                      auVar188 = vshufps_avx(auVar286,auVar286,0xc9);
                      auVar112 = vshufps_avx(auVar235,auVar235,0xc9);
                      auVar286 = vshufps_avx(auVar286,auVar286,0xd2);
                      auVar110._0_4_ = auVar235._0_4_ * auVar286._0_4_;
                      auVar110._4_4_ = auVar235._4_4_ * auVar286._4_4_;
                      auVar110._8_4_ = auVar235._8_4_ * auVar286._8_4_;
                      auVar110._12_4_ = auVar235._12_4_ * auVar286._12_4_;
                      auVar188 = vfmsub231ps_fma(auVar110,auVar188,auVar112);
                      uVar97 = auVar188._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        uVar3 = vextractps_avx(auVar188,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar188,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar97;
                        *(float *)(ray + k * 4 + 0xf0) = fVar247;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar92;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar136._4_4_ = fVar247;
                        auVar136._0_4_ = fVar247;
                        auVar136._8_4_ = fVar247;
                        auVar136._12_4_ = fVar247;
                        local_6e0 = (RTCHitN  [16])vshufps_avx(auVar188,auVar188,0x55);
                        auVar188 = vshufps_avx(auVar188,auVar188,0xaa);
                        auStack_6d0 = auVar188;
                        local_6c0 = uVar97;
                        uStack_6bc = uVar97;
                        uStack_6b8 = uVar97;
                        uStack_6b4 = uVar97;
                        local_6b0 = auVar136;
                        local_6a0 = ZEXT416(0) << 0x20;
                        local_690 = CONCAT44(uStack_6fc,local_700);
                        uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                        local_680._4_4_ = uStack_6ec;
                        local_680._0_4_ = local_6f0;
                        local_680._8_4_ = uStack_6e8;
                        local_680._12_4_ = uStack_6e4;
                        vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                        uStack_66c = context->user->instID[0];
                        local_670 = uStack_66c;
                        uStack_668 = uStack_66c;
                        uStack_664 = uStack_66c;
                        uStack_660 = context->user->instPrimID[0];
                        uStack_65c = uStack_660;
                        uStack_658 = uStack_660;
                        uStack_654 = uStack_660;
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        local_b20 = *local_9c8;
                        uStack_b18 = local_9c8[1];
                        local_a30.valid = (int *)&local_b20;
                        local_a30.geometryUserPtr = pGVar4->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_6e0;
                        local_a30.N = 4;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar242 = ZEXT1664(auVar105);
                          auVar294 = ZEXT1664(auVar6);
                          auVar300 = ZEXT1664(auVar300._0_16_);
                          (*pGVar4->intersectionFilterN)(&local_a30);
                          auVar201._8_56_ = extraout_var_01;
                          auVar201._0_8_ = extraout_XMM1_Qa;
                          auVar136 = auVar201._0_16_;
                          auVar282 = ZEXT1664(ZEXT416((uint)fVar233));
                          auVar201 = ZEXT1664(ZEXT416((uint)fVar247));
                          auVar261 = ZEXT3264(local_ae0);
                        }
                        auVar58._8_8_ = uStack_b18;
                        auVar58._0_8_ = local_b20;
                        if (auVar58 == (undefined1  [16])0x0) {
                          auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar112 = vpcmpeqd_avx(auVar136,auVar136);
                          auVar188 = auVar188 ^ auVar112;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar112 = vpcmpeqd_avx(auVar188,auVar188);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar294 = ZEXT1664(auVar294._0_16_);
                            auVar300 = ZEXT1664(auVar300._0_16_);
                            (*p_Var5)(&local_a30);
                            auVar282 = ZEXT1664(ZEXT416((uint)fVar233));
                            auVar201 = ZEXT1664(ZEXT416((uint)fVar247));
                            auVar261 = ZEXT3264(local_ae0);
                            auVar112 = vpcmpeqd_avx(auVar112,auVar112);
                          }
                          auVar59._8_8_ = uStack_b18;
                          auVar59._0_8_ = local_b20;
                          auVar286 = vpcmpeqd_avx(auVar59,_DAT_01feba10);
                          auVar188 = auVar286 ^ auVar112;
                          if (auVar59 != (undefined1  [16])0x0) {
                            auVar286 = auVar286 ^ auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar112;
                          }
                        }
                        auVar137._8_8_ = 0x100000001;
                        auVar137._0_8_ = 0x100000001;
                        if ((auVar137 & auVar188) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar102;
                        }
                      }
                    }
                  }
                }
                auVar117 = local_5a0;
                bVar100 = lVar99 != 0;
                lVar99 = lVar99 + -1;
              } while ((!bVar50) && (bVar100));
              uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar121._4_4_ = uVar97;
              auVar121._0_4_ = uVar97;
              auVar121._8_4_ = uVar97;
              auVar121._12_4_ = uVar97;
              auVar121._16_4_ = uVar97;
              auVar121._20_4_ = uVar97;
              auVar121._24_4_ = uVar97;
              auVar121._28_4_ = uVar97;
              auVar124 = vcmpps_avx(_local_7e0,auVar121,2);
              local_5a0 = vandps_avx(auVar124,local_5a0);
              auVar117 = auVar117 & auVar124;
              uVar98 = local_600._0_8_;
              auVar188 = local_760._16_16_;
            } while ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar117 >> 0x7f,0) != '\0') ||
                       (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar117 >> 0xbf,0) != '\0') ||
                     (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar117[0x1f] < '\0');
          }
          local_760._16_16_ = auVar188;
          auVar49._4_4_ = (float)local_620._4_4_ * (float)local_820._4_4_;
          auVar49._0_4_ = (float)local_620._0_4_ * (float)local_820._0_4_;
          auVar49._8_4_ = fStack_618 * fStack_818;
          auVar49._12_4_ = fStack_614 * fStack_814;
          auVar49._16_4_ = fStack_610 * fStack_810;
          auVar49._20_4_ = fStack_60c * fStack_80c;
          auVar49._24_4_ = fStack_608 * fStack_808;
          auVar49._28_4_ = uStack_604;
          auVar188 = vfmadd132ps_fma(local_880,auVar49,_local_800);
          auVar188 = vfmadd132ps_fma(local_860,ZEXT1632(auVar188),_local_7c0);
          auVar68._4_4_ = uStack_83c;
          auVar68._0_4_ = local_840;
          auVar68._8_4_ = uStack_838;
          auVar68._12_4_ = uStack_834;
          auVar68._16_4_ = uStack_830;
          auVar68._20_4_ = uStack_82c;
          auVar68._24_4_ = uStack_828;
          auVar68._28_4_ = uStack_824;
          auVar117 = vandps_avx(ZEXT1632(auVar188),auVar68);
          auVar156._8_4_ = 0x3e99999a;
          auVar156._0_8_ = 0x3e99999a3e99999a;
          auVar156._12_4_ = 0x3e99999a;
          auVar156._16_4_ = 0x3e99999a;
          auVar156._20_4_ = 0x3e99999a;
          auVar156._24_4_ = 0x3e99999a;
          auVar156._28_4_ = 0x3e99999a;
          auVar117 = vcmpps_avx(auVar117,auVar156,1);
          auVar124 = vorps_avx(auVar117,local_560);
          auVar157._0_4_ = auVar261._0_4_ + (float)local_780._0_4_;
          auVar157._4_4_ = auVar261._4_4_ + (float)local_780._4_4_;
          auVar157._8_4_ = auVar261._8_4_ + fStack_778;
          auVar157._12_4_ = auVar261._12_4_ + fStack_774;
          auVar157._16_4_ = auVar261._16_4_ + fStack_770;
          auVar157._20_4_ = auVar261._20_4_ + fStack_76c;
          auVar157._24_4_ = auVar261._24_4_ + fStack_768;
          auVar157._28_4_ = auVar261._28_4_ + fStack_764;
          uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar175._4_4_ = uVar97;
          auVar175._0_4_ = uVar97;
          auVar175._8_4_ = uVar97;
          auVar175._12_4_ = uVar97;
          auVar175._16_4_ = uVar97;
          auVar175._20_4_ = uVar97;
          auVar175._24_4_ = uVar97;
          auVar175._28_4_ = uVar97;
          auVar117 = vcmpps_avx(auVar157,auVar175,2);
          local_860 = vandps_avx(auVar117,local_540);
          auVar158._8_4_ = 3;
          auVar158._0_8_ = 0x300000003;
          auVar158._12_4_ = 3;
          auVar158._16_4_ = 3;
          auVar158._20_4_ = 3;
          auVar158._24_4_ = 3;
          auVar158._28_4_ = 3;
          auVar176._8_4_ = 2;
          auVar176._0_8_ = 0x200000002;
          auVar176._12_4_ = 2;
          auVar176._16_4_ = 2;
          auVar176._20_4_ = 2;
          auVar176._24_4_ = 2;
          auVar176._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar176,auVar158,auVar124);
          local_880 = vpcmpgtd_avx2(auVar117,local_580);
          local_5c0 = vpandn_avx2(local_880,local_860);
          auVar117 = local_860 & ~local_880;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar112 = vminps_avx(local_a40,local_a60);
            auVar188 = vmaxps_avx(local_a40,local_a60);
            auVar286 = vminps_avx(local_a50,_local_a70);
            auVar6 = vminps_avx(auVar112,auVar286);
            auVar112 = vmaxps_avx(local_a50,_local_a70);
            auVar286 = vmaxps_avx(auVar188,auVar112);
            auVar188 = vandps_avx(auVar6,local_920);
            auVar112 = vandps_avx(auVar286,local_920);
            auVar188 = vmaxps_avx(auVar188,auVar112);
            auVar112 = vmovshdup_avx(auVar188);
            auVar112 = vmaxss_avx(auVar112,auVar188);
            auVar188 = vshufpd_avx(auVar188,auVar188,1);
            auVar188 = vmaxss_avx(auVar188,auVar112);
            local_980._0_4_ = auVar188._0_4_ * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar286,auVar286,0xff);
            local_7a0 = _local_2a0;
            local_7e0._4_4_ = (float)local_2a0._4_4_ + (float)local_780._4_4_;
            local_7e0._0_4_ = (float)local_2a0._0_4_ + (float)local_780._0_4_;
            fStack_7d8 = fStack_298 + fStack_778;
            fStack_7d4 = fStack_294 + fStack_774;
            fStack_7d0 = fStack_290 + fStack_770;
            fStack_7cc = fStack_28c + fStack_76c;
            fStack_7c8 = fStack_288 + fStack_768;
            fStack_7c4 = fStack_284 + fStack_764;
            do {
              auVar159._8_4_ = 0x7f800000;
              auVar159._0_8_ = 0x7f8000007f800000;
              auVar159._12_4_ = 0x7f800000;
              auVar159._16_4_ = 0x7f800000;
              auVar159._20_4_ = 0x7f800000;
              auVar159._24_4_ = 0x7f800000;
              auVar159._28_4_ = 0x7f800000;
              auVar117 = vblendvps_avx(auVar159,local_7a0,local_5c0);
              auVar124 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar124 = vminps_avx(auVar117,auVar124);
              auVar9 = vshufpd_avx(auVar124,auVar124,5);
              auVar124 = vminps_avx(auVar124,auVar9);
              auVar9 = vpermpd_avx2(auVar124,0x4e);
              auVar124 = vminps_avx(auVar124,auVar9);
              auVar124 = vcmpps_avx(auVar117,auVar124,0);
              auVar9 = local_5c0 & auVar124;
              auVar117 = local_5c0;
              if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar9[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar124,local_5c0);
              }
              uVar93 = vmovmskps_avx(auVar117);
              iVar12 = 0;
              for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar94 = iVar12 << 2;
              *(undefined4 *)(local_5c0 + uVar94) = 0;
              uVar93 = *(uint *)(local_500 + uVar94);
              uVar94 = *(uint *)(local_280 + uVar94);
              fVar233 = local_b08;
              if ((float)local_930._0_4_ < 0.0) {
                fVar233 = sqrtf((float)local_930._0_4_);
              }
              auVar282 = ZEXT464(uVar94);
              auVar201 = ZEXT464(uVar93);
              local_9a0._0_4_ = fVar233 * 1.9073486e-06;
              lVar99 = 4;
              do {
                fVar233 = auVar282._0_4_;
                auVar111._4_4_ = fVar233;
                auVar111._0_4_ = fVar233;
                auVar111._8_4_ = fVar233;
                auVar111._12_4_ = fVar233;
                auVar112 = vfmadd213ps_fma(auVar111,local_910,_DAT_01feba10);
                fVar248 = auVar201._0_4_;
                fVar247 = 1.0 - fVar248;
                local_aa0._0_16_ = ZEXT416((uint)fVar247);
                fVar244 = fVar248 * fVar248;
                auVar141 = SUB6416(ZEXT464(0x40400000),0);
                auVar235 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar106 = auVar201._0_16_;
                auVar286 = vfmadd213ss_fma(auVar141,auVar106,auVar235);
                auVar188 = vfmadd213ss_fma(auVar286,ZEXT416((uint)fVar244),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar6 = vfmadd213ss_fma(auVar141,ZEXT416((uint)fVar247),auVar235);
                auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)(fVar247 * fVar247)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar102 = fVar247 * fVar247 * -fVar248 * 0.5;
                fVar245 = auVar188._0_4_ * 0.5;
                fVar246 = auVar6._0_4_ * 0.5;
                fVar214 = fVar248 * fVar248 * -fVar247 * 0.5;
                auVar189._0_4_ = fVar214 * (float)local_a70._0_4_;
                auVar189._4_4_ = fVar214 * (float)local_a70._4_4_;
                auVar189._8_4_ = fVar214 * fStack_a68;
                auVar189._12_4_ = fVar214 * fStack_a64;
                auVar207._4_4_ = fVar246;
                auVar207._0_4_ = fVar246;
                auVar207._8_4_ = fVar246;
                auVar207._12_4_ = fVar246;
                auVar188 = vfmadd132ps_fma(auVar207,auVar189,local_a50);
                auVar168._4_4_ = fVar245;
                auVar168._0_4_ = fVar245;
                auVar168._8_4_ = fVar245;
                auVar168._12_4_ = fVar245;
                auVar188 = vfmadd132ps_fma(auVar168,auVar188,local_a60);
                auVar190._4_4_ = fVar102;
                auVar190._0_4_ = fVar102;
                auVar190._8_4_ = fVar102;
                auVar190._12_4_ = fVar102;
                auVar188 = vfmadd132ps_fma(auVar190,auVar188,local_a40);
                auVar235 = vfmadd231ss_fma(auVar235,auVar106,ZEXT416(0x41100000));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar106,ZEXT416(0x40800000)
                                        );
                local_a00._0_16_ = auVar6;
                local_720._0_16_ = auVar188;
                auVar188 = vsubps_avx(auVar112,auVar188);
                _local_960 = auVar188;
                auVar188 = vdpps_avx(auVar188,auVar188,0x7f);
                auVar112 = vfmadd213ss_fma(auVar141,auVar106,ZEXT416(0xbf800000));
                local_ac0._0_16_ = auVar112;
                fVar102 = auVar188._0_4_;
                if (fVar102 < 0.0) {
                  local_9c0._0_4_ = auVar286._0_4_;
                  local_ae0._0_4_ = fVar244;
                  local_b00._0_4_ = fVar247 * -2.0;
                  local_aa0._0_16_ = ZEXT416((uint)fVar247);
                  auVar261._0_4_ = sqrtf(fVar102);
                  auVar261._4_60_ = extraout_var_00;
                  auVar286 = ZEXT416((uint)local_9c0._0_4_);
                  auVar112 = auVar261._0_16_;
                  fVar245 = (float)local_b00._0_4_;
                  fVar244 = (float)local_ae0._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar188,auVar188);
                  fVar245 = fVar247 * -2.0;
                }
                fVar246 = local_aa0._0_4_;
                auVar286 = vfmadd213ss_fma(auVar286,ZEXT416((uint)(fVar248 + fVar248)),
                                           ZEXT416((uint)(fVar248 * fVar248 * 3.0)));
                auVar133 = SUB6416(ZEXT464(0x40000000),0);
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar106,auVar133);
                auVar141 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -3.0)),
                                           ZEXT416((uint)(fVar246 + fVar246)),auVar6);
                auVar105 = vfnmadd231ss_fma(ZEXT416((uint)(fVar248 * (fVar246 + fVar246))),
                                            local_aa0._0_16_,local_aa0._0_16_);
                auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar245),auVar106,ZEXT416((uint)fVar244));
                fVar244 = auVar105._0_4_ * 0.5;
                fVar245 = auVar286._0_4_ * 0.5;
                fVar246 = auVar141._0_4_ * 0.5;
                fVar214 = auVar6._0_4_ * 0.5;
                auVar191._0_4_ = (float)local_a70._0_4_ * fVar214;
                auVar191._4_4_ = (float)local_a70._4_4_ * fVar214;
                auVar191._8_4_ = fStack_a68 * fVar214;
                auVar191._12_4_ = fStack_a64 * fVar214;
                auVar169._4_4_ = fVar246;
                auVar169._0_4_ = fVar246;
                auVar169._8_4_ = fVar246;
                auVar169._12_4_ = fVar246;
                auVar286 = vfmadd213ps_fma(auVar169,local_a50,auVar191);
                auVar138._4_4_ = fVar245;
                auVar138._0_4_ = fVar245;
                auVar138._8_4_ = fVar245;
                auVar138._12_4_ = fVar245;
                auVar286 = vfmadd213ps_fma(auVar138,local_a60,auVar286);
                auVar288._4_4_ = fVar244;
                auVar288._0_4_ = fVar244;
                auVar288._8_4_ = fVar244;
                auVar288._12_4_ = fVar244;
                local_aa0._0_16_ = vfmadd213ps_fma(auVar288,local_a40,auVar286);
                auVar141 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar106,auVar133);
                auVar113._0_4_ = (float)local_a70._0_4_ * (float)local_ac0._0_4_;
                auVar113._4_4_ = (float)local_a70._4_4_ * (float)local_ac0._0_4_;
                auVar113._8_4_ = fStack_a68 * (float)local_ac0._0_4_;
                auVar113._12_4_ = fStack_a64 * (float)local_ac0._0_4_;
                auVar170._4_4_ = local_a00._0_4_;
                auVar170._0_4_ = local_a00._0_4_;
                auVar170._8_4_ = local_a00._0_4_;
                auVar170._12_4_ = local_a00._0_4_;
                auVar286 = vfmadd213ps_fma(auVar170,local_a50,auVar113);
                uVar97 = auVar235._0_4_;
                auVar192._4_4_ = uVar97;
                auVar192._0_4_ = uVar97;
                auVar192._8_4_ = uVar97;
                auVar192._12_4_ = uVar97;
                auVar286 = vfmadd213ps_fma(auVar192,local_a60,auVar286);
                auVar6 = vdpps_avx(local_aa0._0_16_,local_aa0._0_16_,0x7f);
                auVar139._0_4_ = auVar141._0_4_;
                auVar139._4_4_ = auVar139._0_4_;
                auVar139._8_4_ = auVar139._0_4_;
                auVar139._12_4_ = auVar139._0_4_;
                auVar141 = vfmadd213ps_fma(auVar139,local_a40,auVar286);
                auVar286 = vblendps_avx(auVar6,_DAT_01feba10,0xe);
                auVar235 = vrsqrtss_avx(auVar286,auVar286);
                fVar246 = auVar6._0_4_;
                fVar244 = auVar235._0_4_;
                auVar235 = vdpps_avx(local_aa0._0_16_,auVar141,0x7f);
                fVar244 = fVar244 * 1.5 + fVar246 * -0.5 * fVar244 * fVar244 * fVar244;
                auVar140._0_4_ = auVar141._0_4_ * fVar246;
                auVar140._4_4_ = auVar141._4_4_ * fVar246;
                auVar140._8_4_ = auVar141._8_4_ * fVar246;
                auVar140._12_4_ = auVar141._12_4_ * fVar246;
                fVar245 = auVar235._0_4_;
                auVar222._0_4_ = local_aa0._0_4_ * fVar245;
                auVar222._4_4_ = local_aa0._4_4_ * fVar245;
                fVar214 = local_aa0._8_4_;
                auVar222._8_4_ = fVar214 * fVar245;
                fVar247 = local_aa0._12_4_;
                auVar222._12_4_ = fVar247 * fVar245;
                auVar235 = vsubps_avx(auVar140,auVar222);
                auVar286 = vrcpss_avx(auVar286,auVar286);
                auVar141 = vfnmadd213ss_fma(auVar286,auVar6,auVar133);
                fVar245 = auVar286._0_4_ * auVar141._0_4_;
                auVar286 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(fVar233 * (float)local_9a0._0_4_)));
                auVar261 = ZEXT1664(auVar286);
                auVar237._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = -fVar214;
                auVar237._12_4_ = -fVar247;
                auVar193._0_4_ = fVar244 * auVar235._0_4_ * fVar245;
                auVar193._4_4_ = fVar244 * auVar235._4_4_ * fVar245;
                auVar193._8_4_ = fVar244 * auVar235._8_4_ * fVar245;
                auVar193._12_4_ = fVar244 * auVar235._12_4_ * fVar245;
                auVar274._0_4_ = local_aa0._0_4_ * fVar244;
                auVar274._4_4_ = local_aa0._4_4_ * fVar244;
                auVar274._8_4_ = fVar214 * fVar244;
                auVar274._12_4_ = fVar247 * fVar244;
                local_a00._0_4_ = auVar286._0_4_;
                if (fVar246 < -fVar246) {
                  local_ac0._0_4_ = auVar112._0_4_;
                  local_9c0._0_16_ = auVar237;
                  local_ae0._0_16_ = auVar274;
                  fVar244 = sqrtf(fVar246);
                  auVar261 = ZEXT464((uint)local_a00._0_4_);
                  auVar112 = ZEXT416((uint)local_ac0._0_4_);
                  auVar237 = local_9c0._0_16_;
                  auVar274 = local_ae0._0_16_;
                }
                else {
                  auVar286 = vsqrtss_avx(auVar6,auVar6);
                  fVar244 = auVar286._0_4_;
                }
                auVar286 = vdpps_avx(_local_960,auVar274,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)local_980._0_4_),auVar112,auVar261._0_16_);
                auVar6 = vdpps_avx(auVar237,auVar274,0x7f);
                auVar235 = vdpps_avx(_local_960,auVar193,0x7f);
                auVar141 = vdpps_avx(local_910,auVar274,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_980._0_4_ / fVar244)),
                                           auVar106);
                auVar294 = ZEXT1664(auVar106);
                fVar244 = auVar6._0_4_ + auVar235._0_4_;
                auVar300 = ZEXT464((uint)fVar244);
                auVar114._0_4_ = auVar286._0_4_ * auVar286._0_4_;
                auVar114._4_4_ = auVar286._4_4_ * auVar286._4_4_;
                auVar114._8_4_ = auVar286._8_4_ * auVar286._8_4_;
                auVar114._12_4_ = auVar286._12_4_ * auVar286._12_4_;
                auVar112 = vdpps_avx(_local_960,auVar237,0x7f);
                auVar235 = vsubps_avx(auVar188,auVar114);
                auVar6 = vrsqrtss_avx(auVar235,auVar235);
                fVar246 = auVar235._0_4_;
                fVar245 = auVar6._0_4_;
                fVar245 = fVar245 * 1.5 + fVar246 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar6 = vdpps_avx(_local_960,local_910,0x7f);
                auVar112 = vfnmadd231ss_fma(auVar112,auVar286,ZEXT416((uint)fVar244));
                auVar6 = vfnmadd231ss_fma(auVar6,auVar286,auVar141);
                if (fVar246 < 0.0) {
                  local_ac0._0_16_ = auVar286;
                  local_9c0._0_4_ = auVar106._0_4_;
                  local_ae0._0_16_ = ZEXT416((uint)fVar244);
                  local_b00._0_16_ = auVar112;
                  local_8e0._0_4_ = fVar245;
                  local_740._0_16_ = auVar6;
                  fVar244 = sqrtf(fVar246);
                  auVar300 = ZEXT1664(local_ae0._0_16_);
                  auVar294 = ZEXT464((uint)local_9c0._0_4_);
                  auVar261 = ZEXT464((uint)local_a00._0_4_);
                  fVar245 = (float)local_8e0._0_4_;
                  auVar6 = local_740._0_16_;
                  auVar286 = local_ac0._0_16_;
                  auVar112 = local_b00._0_16_;
                }
                else {
                  auVar235 = vsqrtss_avx(auVar235,auVar235);
                  fVar244 = auVar235._0_4_;
                }
                auVar242 = ZEXT1664(local_aa0._0_16_);
                auVar106 = vpermilps_avx(local_720._0_16_,0xff);
                auVar235 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
                auVar112 = vfmsub213ss_fma(auVar112,ZEXT416((uint)fVar245),auVar235);
                auVar194._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = auVar141._8_4_ ^ 0x80000000;
                auVar194._12_4_ = auVar141._12_4_ ^ 0x80000000;
                auVar208._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
                auVar208._8_4_ = auVar112._8_4_ ^ 0x80000000;
                auVar208._12_4_ = auVar112._12_4_ ^ 0x80000000;
                auVar105 = ZEXT416((uint)(auVar6._0_4_ * fVar245));
                auVar133 = auVar300._0_16_;
                auVar6 = vfmsub231ss_fma(ZEXT416((uint)(auVar141._0_4_ * auVar112._0_4_)),auVar133,
                                         auVar105);
                auVar112 = vinsertps_avx(auVar105,auVar194,0x10);
                uVar97 = auVar6._0_4_;
                auVar195._4_4_ = uVar97;
                auVar195._0_4_ = uVar97;
                auVar195._8_4_ = uVar97;
                auVar195._12_4_ = uVar97;
                auVar112 = vdivps_avx(auVar112,auVar195);
                auVar141 = ZEXT416((uint)(fVar244 - auVar106._0_4_));
                auVar6 = vinsertps_avx(auVar286,auVar141,0x10);
                auVar171._0_4_ = auVar6._0_4_ * auVar112._0_4_;
                auVar171._4_4_ = auVar6._4_4_ * auVar112._4_4_;
                auVar171._8_4_ = auVar6._8_4_ * auVar112._8_4_;
                auVar171._12_4_ = auVar6._12_4_ * auVar112._12_4_;
                auVar112 = vinsertps_avx(auVar208,auVar133,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar195);
                auVar196._0_4_ = auVar6._0_4_ * auVar112._0_4_;
                auVar196._4_4_ = auVar6._4_4_ * auVar112._4_4_;
                auVar196._8_4_ = auVar6._8_4_ * auVar112._8_4_;
                auVar196._12_4_ = auVar6._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar171,auVar171);
                auVar6 = vhaddps_avx(auVar196,auVar196);
                fVar248 = fVar248 - auVar112._0_4_;
                auVar201 = ZEXT464((uint)fVar248);
                fVar233 = fVar233 - auVar6._0_4_;
                auVar282 = ZEXT464((uint)fVar233);
                auVar112 = vandps_avx(auVar286,local_920);
                if (auVar294._0_4_ <= auVar112._0_4_) {
LAB_016b9c93:
                  bVar50 = false;
                }
                else {
                  auVar286 = vfmadd231ss_fma(ZEXT416((uint)(auVar261._0_4_ + auVar294._0_4_)),
                                             local_760._0_16_,ZEXT416(0x36000000));
                  auVar112 = vandps_avx(auVar141,local_920);
                  if (auVar286._0_4_ <= auVar112._0_4_) goto LAB_016b9c93;
                  fVar233 = fVar233 + (float)local_8a0._0_4_;
                  auVar282 = ZEXT464((uint)fVar233);
                  bVar50 = true;
                  if ((((fVar101 <= fVar233) &&
                       (fVar244 = *(float *)(ray + k * 4 + 0x80), fVar233 <= fVar244)) &&
                      (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                    auVar188 = vrsqrtss_avx(auVar188,auVar188);
                    fVar245 = auVar188._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar92].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar102 = fVar245 * 1.5 + fVar102 * -0.5 * fVar245 * fVar245 * fVar245;
                      auVar142._0_4_ = fVar102 * (float)local_960._0_4_;
                      auVar142._4_4_ = fVar102 * (float)local_960._4_4_;
                      auVar142._8_4_ = fVar102 * fStack_958;
                      auVar142._12_4_ = fVar102 * fStack_954;
                      auVar6 = vfmadd213ps_fma(auVar235,auVar142,local_aa0._0_16_);
                      auVar188 = vshufps_avx(auVar142,auVar142,0xc9);
                      auVar112 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                      auVar143._0_4_ = auVar142._0_4_ * auVar112._0_4_;
                      auVar143._4_4_ = auVar142._4_4_ * auVar112._4_4_;
                      auVar143._8_4_ = auVar142._8_4_ * auVar112._8_4_;
                      auVar143._12_4_ = auVar142._12_4_ * auVar112._12_4_;
                      auVar286 = vfmsub231ps_fma(auVar143,local_aa0._0_16_,auVar188);
                      auVar188 = vshufps_avx(auVar286,auVar286,0xc9);
                      auVar112 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar286 = vshufps_avx(auVar286,auVar286,0xd2);
                      auVar115._0_4_ = auVar6._0_4_ * auVar286._0_4_;
                      auVar115._4_4_ = auVar6._4_4_ * auVar286._4_4_;
                      auVar115._8_4_ = auVar6._8_4_ * auVar286._8_4_;
                      auVar115._12_4_ = auVar6._12_4_ * auVar286._12_4_;
                      auVar188 = vfmsub231ps_fma(auVar115,auVar188,auVar112);
                      uVar97 = auVar188._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        uVar3 = vextractps_avx(auVar188,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar188,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar97;
                        *(float *)(ray + k * 4 + 0xf0) = fVar248;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar92;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar144._4_4_ = fVar248;
                        auVar144._0_4_ = fVar248;
                        auVar144._8_4_ = fVar248;
                        auVar144._12_4_ = fVar248;
                        local_6e0 = (RTCHitN  [16])vshufps_avx(auVar188,auVar188,0x55);
                        auVar188 = vshufps_avx(auVar188,auVar188,0xaa);
                        auStack_6d0 = auVar188;
                        local_6c0 = uVar97;
                        uStack_6bc = uVar97;
                        uStack_6b8 = uVar97;
                        uStack_6b4 = uVar97;
                        local_6b0 = auVar144;
                        local_6a0 = ZEXT416(0) << 0x20;
                        local_690 = CONCAT44(uStack_6fc,local_700);
                        uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                        local_680._4_4_ = uStack_6ec;
                        local_680._0_4_ = local_6f0;
                        local_680._8_4_ = uStack_6e8;
                        local_680._12_4_ = uStack_6e4;
                        vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                        uStack_66c = context->user->instID[0];
                        local_670 = uStack_66c;
                        uStack_668 = uStack_66c;
                        uStack_664 = uStack_66c;
                        uStack_660 = context->user->instPrimID[0];
                        uStack_65c = uStack_660;
                        uStack_658 = uStack_660;
                        uStack_654 = uStack_660;
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        local_b20 = *local_9c8;
                        uStack_b18 = local_9c8[1];
                        local_a30.valid = (int *)&local_b20;
                        local_a30.geometryUserPtr = pGVar4->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_6e0;
                        local_a30.N = 4;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar242 = ZEXT1664(local_aa0._0_16_);
                          auVar261 = ZEXT1664(auVar261._0_16_);
                          auVar294 = ZEXT1664(auVar294._0_16_);
                          auVar300 = ZEXT1664(auVar133);
                          (*pGVar4->intersectionFilterN)(&local_a30);
                          auVar163._8_56_ = extraout_var_02;
                          auVar163._0_8_ = extraout_XMM1_Qa_00;
                          auVar144 = auVar163._0_16_;
                          auVar282 = ZEXT1664(ZEXT416((uint)fVar233));
                          auVar201 = ZEXT1664(ZEXT416((uint)fVar248));
                        }
                        auVar60._8_8_ = uStack_b18;
                        auVar60._0_8_ = local_b20;
                        if (auVar60 == (undefined1  [16])0x0) {
                          auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar112 = vpcmpeqd_avx(auVar144,auVar144);
                          auVar188 = auVar188 ^ auVar112;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar112 = vpcmpeqd_avx(auVar188,auVar188);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            auVar294 = ZEXT1664(auVar294._0_16_);
                            auVar300 = ZEXT1664(auVar300._0_16_);
                            (*p_Var5)(&local_a30);
                            auVar282 = ZEXT1664(ZEXT416((uint)fVar233));
                            auVar201 = ZEXT1664(ZEXT416((uint)fVar248));
                            auVar112 = vpcmpeqd_avx(auVar112,auVar112);
                          }
                          auVar61._8_8_ = uStack_b18;
                          auVar61._0_8_ = local_b20;
                          auVar286 = vpcmpeqd_avx(auVar61,_DAT_01feba10);
                          auVar188 = auVar286 ^ auVar112;
                          if (auVar61 != (undefined1  [16])0x0) {
                            auVar286 = auVar286 ^ auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar112;
                            auVar112 = vmaskmovps_avx(auVar286,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar112;
                          }
                        }
                        auVar145._8_8_ = 0x100000001;
                        auVar145._0_8_ = 0x100000001;
                        if ((auVar145 & auVar188) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar244;
                        }
                      }
                    }
                  }
                }
                auVar117 = local_5c0;
                bVar100 = lVar99 != 0;
                lVar99 = lVar99 + -1;
              } while ((!bVar50) && (bVar100));
              uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar122._4_4_ = uVar97;
              auVar122._0_4_ = uVar97;
              auVar122._8_4_ = uVar97;
              auVar122._12_4_ = uVar97;
              auVar122._16_4_ = uVar97;
              auVar122._20_4_ = uVar97;
              auVar122._24_4_ = uVar97;
              auVar122._28_4_ = uVar97;
              auVar124 = vcmpps_avx(_local_7e0,auVar122,2);
              local_5c0 = vandps_avx(auVar124,local_5c0);
              auVar117 = auVar117 & auVar124;
              uVar98 = local_600._0_8_;
            } while ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar117 >> 0x7f,0) != '\0') ||
                       (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar117 >> 0xbf,0) != '\0') ||
                     (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar117[0x1f] < '\0');
          }
          auVar160._0_4_ = (float)local_780._0_4_ + local_2e0._0_4_;
          auVar160._4_4_ = (float)local_780._4_4_ + local_2e0._4_4_;
          auVar160._8_4_ = fStack_778 + local_2e0._8_4_;
          auVar160._12_4_ = fStack_774 + local_2e0._12_4_;
          auVar160._16_4_ = fStack_770 + local_2e0._16_4_;
          auVar160._20_4_ = fStack_76c + local_2e0._20_4_;
          auVar160._24_4_ = fStack_768 + local_2e0._24_4_;
          auVar160._28_4_ = fStack_764 + local_2e0._28_4_;
          uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar199._4_4_ = uVar97;
          auVar199._0_4_ = uVar97;
          auVar199._8_4_ = uVar97;
          auVar199._12_4_ = uVar97;
          auVar199._16_4_ = uVar97;
          auVar199._20_4_ = uVar97;
          auVar199._24_4_ = uVar97;
          auVar199._28_4_ = uVar97;
          auVar124 = vcmpps_avx(auVar160,auVar199,2);
          auVar117 = vandps_avx(local_640,_local_520);
          auVar117 = vandps_avx(auVar124,auVar117);
          auVar210._0_4_ = (float)local_780._0_4_ + local_2a0._0_4_;
          auVar210._4_4_ = (float)local_780._4_4_ + local_2a0._4_4_;
          auVar210._8_4_ = fStack_778 + local_2a0._8_4_;
          auVar210._12_4_ = fStack_774 + local_2a0._12_4_;
          auVar210._16_4_ = fStack_770 + local_2a0._16_4_;
          auVar210._20_4_ = fStack_76c + local_2a0._20_4_;
          auVar210._24_4_ = fStack_768 + local_2a0._24_4_;
          auVar210._28_4_ = fStack_764 + local_2a0._28_4_;
          auVar9 = vcmpps_avx(auVar210,auVar199,2);
          auVar124 = vandps_avx(local_880,local_860);
          auVar124 = vandps_avx(auVar9,auVar124);
          auVar124 = vorps_avx(auVar117,auVar124);
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar95 * 0x60) = auVar124;
            auVar117 = vblendvps_avx(_local_2a0,local_2e0,auVar117);
            *(undefined1 (*) [32])(auStack_160 + uVar95 * 0x60) = auVar117;
            auVar63._8_8_ = uStack_8a8;
            auVar63._0_8_ = local_8b0;
            uVar1 = vmovlps_avx(auVar63);
            *(undefined8 *)(afStack_140 + uVar95 * 0x18) = uVar1;
            auStack_138[uVar95 * 0x18] = (int)uVar98 + 1;
            uVar95 = (ulong)((int)uVar95 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar95 == 0) {
        uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar116._4_4_ = uVar97;
        auVar116._0_4_ = uVar97;
        auVar116._8_4_ = uVar97;
        auVar116._12_4_ = uVar97;
        auVar188 = vcmpps_avx(local_4b0,auVar116,2);
        uVar92 = vmovmskps_avx(auVar188);
        uVar92 = (uint)local_888 & uVar92;
        if (uVar92 == 0) {
          return;
        }
        goto LAB_016b76e3;
      }
      uVar96 = (ulong)((int)uVar95 - 1);
      lVar99 = uVar96 * 0x60;
      auVar117 = *(undefined1 (*) [32])(auStack_160 + lVar99);
      auVar123._0_4_ = auVar117._0_4_ + (float)local_780._0_4_;
      auVar123._4_4_ = auVar117._4_4_ + (float)local_780._4_4_;
      auVar123._8_4_ = auVar117._8_4_ + fStack_778;
      auVar123._12_4_ = auVar117._12_4_ + fStack_774;
      auVar123._16_4_ = auVar117._16_4_ + fStack_770;
      auVar123._20_4_ = auVar117._20_4_ + fStack_76c;
      auVar123._24_4_ = auVar117._24_4_ + fStack_768;
      auVar123._28_4_ = auVar117._28_4_ + fStack_764;
      uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar200._4_4_ = uVar97;
      auVar200._0_4_ = uVar97;
      auVar200._8_4_ = uVar97;
      auVar200._12_4_ = uVar97;
      auVar200._16_4_ = uVar97;
      auVar200._20_4_ = uVar97;
      auVar200._24_4_ = uVar97;
      auVar200._28_4_ = uVar97;
      auVar9 = vcmpps_avx(auVar123,auVar200,2);
      auVar124 = vandps_avx(auVar9,*(undefined1 (*) [32])(auStack_180 + lVar99));
      _local_6e0 = auVar124;
      auVar7 = *(undefined1 (*) [32])(auStack_180 + lVar99) & auVar9;
      bVar56 = (auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar55 = (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar54 = SUB321(auVar7 >> 0x7f,0) == '\0';
      bVar53 = (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar52 = SUB321(auVar7 >> 0xbf,0) == '\0';
      bVar100 = (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar50 = -1 < auVar7[0x1f];
      if (((((((!bVar56 || !bVar57) || !bVar55) || !bVar54) || !bVar53) || !bVar52) || !bVar100) ||
          !bVar50) {
        auVar177._8_4_ = 0x7f800000;
        auVar177._0_8_ = 0x7f8000007f800000;
        auVar177._12_4_ = 0x7f800000;
        auVar177._16_4_ = 0x7f800000;
        auVar177._20_4_ = 0x7f800000;
        auVar177._24_4_ = 0x7f800000;
        auVar177._28_4_ = 0x7f800000;
        auVar117 = vblendvps_avx(auVar177,auVar117,auVar124);
        auVar9 = vshufps_avx(auVar117,auVar117,0xb1);
        auVar9 = vminps_avx(auVar117,auVar9);
        auVar7 = vshufpd_avx(auVar9,auVar9,5);
        auVar7 = vminps_avx(auVar9,auVar7);
        auVar9 = vpermpd_avx2(auVar7,0x4e);
        auVar7 = vminps_avx(auVar7,auVar9);
        auVar117 = vcmpps_avx(auVar117,auVar7,0);
        auVar7 = auVar124 & auVar117;
        if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar7 >> 0x7f,0) != '\0') ||
              (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar7 >> 0xbf,0) != '\0') ||
            (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar7[0x1f] < '\0') {
          auVar124 = vandps_avx(auVar117,auVar124);
        }
        fVar233 = afStack_140[uVar96 * 0x18 + 1];
        uVar98 = (ulong)auStack_138[uVar96 * 0x18];
        uVar93 = vmovmskps_avx(auVar124);
        iVar12 = 0;
        for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
          iVar12 = iVar12 + 1;
        }
        fVar244 = afStack_140[uVar96 * 0x18];
        auVar125._4_4_ = fVar244;
        auVar125._0_4_ = fVar244;
        auVar125._8_4_ = fVar244;
        auVar125._12_4_ = fVar244;
        auVar125._16_4_ = fVar244;
        auVar125._20_4_ = fVar244;
        auVar125._24_4_ = fVar244;
        auVar125._28_4_ = fVar244;
        *(undefined4 *)(local_6e0 + (uint)(iVar12 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar99) = _local_6e0;
        if ((((((((_local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6e0 >> 0x7f,0) != '\0') ||
              (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6e0 >> 0xbf,0) != '\0') ||
            (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6e0[0x1f] < '\0') {
          uVar96 = uVar95;
        }
        fVar233 = fVar233 - fVar244;
        auVar161._4_4_ = fVar233;
        auVar161._0_4_ = fVar233;
        auVar161._8_4_ = fVar233;
        auVar161._12_4_ = fVar233;
        auVar161._16_4_ = fVar233;
        auVar161._20_4_ = fVar233;
        auVar161._24_4_ = fVar233;
        auVar161._28_4_ = fVar233;
        auVar188 = vfmadd132ps_fma(auVar161,auVar125,_DAT_02020f20);
        local_2e0 = ZEXT1632(auVar188);
        local_8b0 = *(undefined8 *)(local_2e0 + (uint)(iVar12 << 2));
        uStack_8a8 = 0;
      }
      uVar95 = uVar96;
      auVar201 = ZEXT3264(auVar9);
    } while (((((((bVar56 && bVar57) && bVar55) && bVar54) && bVar53) && bVar52) && bVar100) &&
             bVar50);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }